

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_ssse3.c
# Opt level: O1

void idct32_sse2(__m128i *input,__m128i *output)

{
  __m128i alVar1;
  __m128i alVar2;
  __m128i alVar3;
  __m128i alVar4;
  __m128i alVar5;
  longlong lVar6;
  longlong lVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar41 [16];
  __m128i _in1_1;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar140 [16];
  __m128i _in1;
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar164 [16];
  __m128i _in0;
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar182 [16];
  __m128i _in1_5;
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar212 [16];
  __m128i _in1_3;
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  __m128i alVar283;
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  __m128i _in1_2;
  undefined1 auVar302 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  undefined1 auVar333 [16];
  undefined1 auVar334 [16];
  undefined1 auVar335 [16];
  undefined1 auVar336 [16];
  undefined1 auVar337 [16];
  undefined1 auVar338 [16];
  undefined1 auVar342 [16];
  undefined1 auVar343 [16];
  undefined1 auVar347 [16];
  undefined2 local_228;
  undefined2 uStack_226;
  undefined2 uStack_224;
  undefined2 uStack_222;
  undefined2 uStack_220;
  undefined2 uStack_21e;
  undefined2 uStack_21c;
  undefined2 uStack_21a;
  undefined2 local_218;
  undefined2 uStack_216;
  undefined2 uStack_214;
  undefined2 uStack_212;
  undefined2 uStack_210;
  undefined2 uStack_20e;
  undefined2 uStack_20c;
  undefined2 uStack_20a;
  undefined2 local_1f8;
  undefined2 uStack_1f6;
  undefined2 uStack_1f4;
  undefined2 uStack_1f2;
  undefined2 uStack_1f0;
  undefined2 uStack_1ee;
  undefined2 uStack_1ec;
  undefined2 uStack_1ea;
  undefined2 local_1e8;
  undefined2 uStack_1e6;
  undefined2 uStack_1e4;
  undefined2 uStack_1e2;
  undefined2 uStack_1e0;
  undefined2 uStack_1de;
  undefined2 uStack_1dc;
  undefined2 uStack_1da;
  undefined2 local_1d8;
  undefined2 uStack_1d6;
  undefined2 uStack_1d4;
  undefined2 uStack_1d2;
  undefined2 uStack_1d0;
  undefined2 uStack_1ce;
  undefined2 uStack_1cc;
  undefined2 uStack_1ca;
  undefined2 local_1c8;
  undefined2 uStack_1c6;
  undefined2 uStack_1c4;
  undefined2 uStack_1c2;
  undefined2 uStack_1c0;
  undefined2 uStack_1be;
  undefined2 uStack_1bc;
  undefined2 uStack_1ba;
  undefined2 local_198;
  undefined2 uStack_196;
  undefined2 uStack_194;
  undefined2 uStack_192;
  undefined2 uStack_190;
  undefined2 uStack_18e;
  undefined2 uStack_18c;
  undefined2 uStack_18a;
  undefined2 local_188;
  undefined2 uStack_186;
  undefined2 uStack_184;
  undefined2 uStack_182;
  undefined2 uStack_180;
  undefined2 uStack_17e;
  undefined2 uStack_17c;
  undefined2 uStack_17a;
  undefined2 local_108;
  undefined2 uStack_106;
  undefined2 uStack_104;
  undefined2 uStack_102;
  undefined2 uStack_100;
  undefined2 uStack_fe;
  undefined2 uStack_fc;
  undefined2 uStack_fa;
  undefined2 local_e8;
  undefined2 uStack_e6;
  undefined2 uStack_e4;
  undefined2 uStack_e2;
  undefined2 uStack_e0;
  undefined2 uStack_de;
  undefined2 uStack_dc;
  undefined2 uStack_da;
  undefined2 local_c8;
  undefined2 uStack_c6;
  undefined2 uStack_c4;
  undefined2 uStack_c2;
  undefined2 uStack_c0;
  undefined2 uStack_be;
  undefined2 uStack_bc;
  undefined2 uStack_ba;
  undefined2 local_b8;
  undefined2 uStack_b6;
  undefined2 uStack_b4;
  undefined2 uStack_b2;
  undefined2 uStack_b0;
  undefined2 uStack_ae;
  undefined2 uStack_ac;
  undefined2 uStack_aa;
  undefined2 local_48;
  undefined2 uStack_46;
  undefined2 uStack_44;
  undefined2 uStack_42;
  undefined2 uStack_40;
  undefined2 uStack_3e;
  undefined2 uStack_3c;
  undefined2 uStack_3a;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar45 [16];
  undefined1 auVar56 [16];
  undefined1 auVar62 [16];
  undefined1 auVar69 [16];
  undefined1 auVar74 [16];
  undefined1 auVar46 [16];
  undefined1 auVar57 [16];
  undefined1 auVar63 [16];
  undefined1 auVar70 [16];
  undefined1 auVar75 [16];
  undefined1 auVar47 [16];
  undefined1 auVar58 [16];
  undefined1 auVar64 [16];
  undefined1 auVar71 [16];
  undefined1 auVar76 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar114 [16];
  undefined1 auVar126 [16];
  undefined1 auVar137 [16];
  undefined1 auVar115 [16];
  undefined1 auVar127 [16];
  undefined1 auVar138 [16];
  undefined1 auVar116 [16];
  undefined1 auVar128 [16];
  undefined1 auVar139 [16];
  undefined1 auVar149 [16];
  undefined1 auVar155 [16];
  undefined1 auVar161 [16];
  undefined1 auVar150 [16];
  undefined1 auVar156 [16];
  undefined1 auVar162 [16];
  undefined1 auVar151 [16];
  undefined1 auVar157 [16];
  undefined1 auVar163 [16];
  undefined1 auVar167 [16];
  undefined1 auVar179 [16];
  undefined1 auVar168 [16];
  undefined1 auVar180 [16];
  undefined1 auVar169 [16];
  undefined1 auVar181 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar220 [16];
  undefined1 auVar230 [16];
  undefined1 auVar239 [16];
  undefined1 auVar221 [16];
  undefined1 auVar231 [16];
  undefined1 auVar240 [16];
  undefined1 auVar222 [16];
  undefined1 auVar232 [16];
  undefined1 auVar241 [16];
  undefined1 auVar247 [16];
  undefined1 auVar257 [16];
  undefined1 auVar248 [16];
  undefined1 auVar258 [16];
  undefined1 auVar249 [16];
  undefined1 auVar259 [16];
  undefined1 auVar268 [16];
  undefined1 auVar275 [16];
  undefined1 auVar269 [16];
  undefined1 auVar276 [16];
  undefined1 auVar270 [16];
  undefined1 auVar277 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar303 [16];
  undefined1 auVar310 [16];
  undefined1 auVar304 [16];
  undefined1 auVar311 [16];
  undefined1 auVar305 [16];
  undefined1 auVar312 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar330 [16];
  undefined1 auVar339 [16];
  undefined1 auVar344 [16];
  undefined1 auVar331 [16];
  undefined1 auVar340 [16];
  undefined1 auVar345 [16];
  undefined1 auVar332 [16];
  undefined1 auVar341 [16];
  undefined1 auVar346 [16];
  
  alVar283 = input[0x11];
  alVar1 = input[9];
  alVar2 = input[0x19];
  alVar3 = input[5];
  alVar4 = input[0x15];
  alVar5 = input[1];
  lVar6 = input[0xb][0];
  lVar7 = input[0xb][1];
  auVar305._0_12_ = alVar5._0_12_;
  auVar305._12_2_ = alVar5[0]._6_2_;
  auVar305._14_2_ = *(undefined2 *)((long)input[0x1f] + 6);
  auVar304._12_4_ = auVar305._12_4_;
  auVar304._0_10_ = alVar5._0_10_;
  auVar304._10_2_ = *(undefined2 *)((long)input[0x1f] + 4);
  auVar303._10_6_ = auVar304._10_6_;
  auVar303._0_8_ = alVar5[0];
  auVar303._8_2_ = alVar5[0]._4_2_;
  auVar302._8_8_ = auVar303._8_8_;
  auVar302._6_2_ = *(undefined2 *)((long)input[0x1f] + 2);
  auVar302._4_2_ = alVar5[0]._2_2_;
  auVar302._0_2_ = (undefined2)alVar5[0];
  auVar302._2_2_ = (short)input[0x1f][0];
  auVar8._2_2_ = (short)input[0x1f][1];
  auVar8._0_2_ = (short)alVar5[1];
  auVar8._4_2_ = alVar5[1]._2_2_;
  auVar8._6_2_ = *(undefined2 *)((long)input[0x1f] + 10);
  auVar8._8_2_ = alVar5[1]._4_2_;
  auVar8._10_2_ = *(undefined2 *)((long)input[0x1f] + 0xc);
  auVar8._12_2_ = alVar5[1]._6_2_;
  auVar8._14_2_ = *(undefined2 *)((long)input[0x1f] + 0xe);
  auVar213._8_4_ = 0xf00500c9;
  auVar213._0_8_ = 0xf00500c9f00500c9;
  auVar213._12_4_ = 0xf00500c9;
  auVar284 = pmaddwd(auVar302,auVar213);
  auVar214 = pmaddwd(auVar213,auVar8);
  auVar244._8_4_ = 0xc90ffb;
  auVar244._0_8_ = 0xc90ffb00c90ffb;
  auVar244._12_4_ = 0xc90ffb;
  auVar306 = pmaddwd(auVar302,auVar244);
  auVar8 = pmaddwd(auVar8,auVar244);
  auVar285._0_4_ = auVar284._0_4_ + 0x800 >> 0xc;
  auVar285._4_4_ = auVar284._4_4_ + 0x800 >> 0xc;
  auVar285._8_4_ = auVar284._8_4_ + 0x800 >> 0xc;
  auVar285._12_4_ = auVar284._12_4_ + 0x800 >> 0xc;
  auVar215._0_4_ = auVar214._0_4_ + 0x800 >> 0xc;
  auVar215._4_4_ = auVar214._4_4_ + 0x800 >> 0xc;
  auVar215._8_4_ = auVar214._8_4_ + 0x800 >> 0xc;
  auVar215._12_4_ = auVar214._12_4_ + 0x800 >> 0xc;
  auVar286 = packssdw(auVar285,auVar215);
  auVar307._0_4_ = auVar306._0_4_ + 0x800 >> 0xc;
  auVar307._4_4_ = auVar306._4_4_ + 0x800 >> 0xc;
  auVar307._8_4_ = auVar306._8_4_ + 0x800 >> 0xc;
  auVar307._12_4_ = auVar306._12_4_ + 0x800 >> 0xc;
  auVar214._0_4_ = auVar8._0_4_ + 0x800 >> 0xc;
  auVar214._4_4_ = auVar8._4_4_ + 0x800 >> 0xc;
  auVar214._8_4_ = auVar8._8_4_ + 0x800 >> 0xc;
  auVar214._12_4_ = auVar8._12_4_ + 0x800 >> 0xc;
  auVar308 = packssdw(auVar307,auVar214);
  auVar306._0_12_ = alVar283._0_12_;
  auVar306._12_2_ = alVar283[0]._6_2_;
  auVar306._14_2_ = *(undefined2 *)((long)input[0xf] + 6);
  auVar144._12_4_ = auVar306._12_4_;
  auVar144._0_10_ = alVar283._0_10_;
  auVar144._10_2_ = *(undefined2 *)((long)input[0xf] + 4);
  auVar264._10_6_ = auVar144._10_6_;
  auVar264._0_8_ = alVar283[0];
  auVar264._8_2_ = alVar283[0]._4_2_;
  auVar284._8_8_ = auVar264._8_8_;
  auVar284._6_2_ = *(undefined2 *)((long)input[0xf] + 2);
  auVar284._4_2_ = alVar283[0]._2_2_;
  auVar284._0_2_ = (undefined2)alVar283[0];
  auVar284._2_2_ = (short)input[0xf][0];
  auVar109._2_2_ = (short)input[0xf][1];
  auVar109._0_2_ = (short)alVar283[1];
  auVar109._4_2_ = alVar283[1]._2_2_;
  auVar109._6_2_ = *(undefined2 *)((long)input[0xf] + 10);
  auVar109._8_2_ = alVar283[1]._4_2_;
  auVar109._10_2_ = *(undefined2 *)((long)input[0xf] + 0xc);
  auVar109._12_2_ = alVar283[1]._6_2_;
  auVar109._14_2_ = *(undefined2 *)((long)input[0xf] + 0xe);
  auVar216._8_4_ = 0xf5410bdb;
  auVar216._0_8_ = 0xf5410bdbf5410bdb;
  auVar216._12_4_ = 0xf5410bdb;
  auVar264 = pmaddwd(auVar284,auVar216);
  auVar306 = pmaddwd(auVar216,auVar109);
  auVar245._8_4_ = 0xbdb0abf;
  auVar245._0_8_ = 0xbdb0abf0bdb0abf;
  auVar245._12_4_ = 0xbdb0abf;
  auVar8 = pmaddwd(auVar284,auVar245);
  auVar214 = pmaddwd(auVar109,auVar245);
  auVar265._0_4_ = auVar264._0_4_ + 0x800 >> 0xc;
  auVar265._4_4_ = auVar264._4_4_ + 0x800 >> 0xc;
  auVar265._8_4_ = auVar264._8_4_ + 0x800 >> 0xc;
  auVar265._12_4_ = auVar264._12_4_ + 0x800 >> 0xc;
  auVar217._0_4_ = auVar306._0_4_ + 0x800 >> 0xc;
  auVar217._4_4_ = auVar306._4_4_ + 0x800 >> 0xc;
  auVar217._8_4_ = auVar306._8_4_ + 0x800 >> 0xc;
  auVar217._12_4_ = auVar306._12_4_ + 0x800 >> 0xc;
  auVar266 = packssdw(auVar265,auVar217);
  auVar14._0_4_ = auVar8._0_4_ + 0x800 >> 0xc;
  auVar14._4_4_ = auVar8._4_4_ + 0x800 >> 0xc;
  auVar14._8_4_ = auVar8._8_4_ + 0x800 >> 0xc;
  auVar14._12_4_ = auVar8._12_4_ + 0x800 >> 0xc;
  auVar110._0_4_ = auVar214._0_4_ + 0x800 >> 0xc;
  auVar110._4_4_ = auVar214._4_4_ + 0x800 >> 0xc;
  auVar110._8_4_ = auVar214._8_4_ + 0x800 >> 0xc;
  auVar110._12_4_ = auVar214._12_4_ + 0x800 >> 0xc;
  auVar8 = packssdw(auVar14,auVar110);
  auVar326._0_12_ = alVar1._0_12_;
  auVar326._12_2_ = alVar1[0]._6_2_;
  auVar326._14_2_ = *(undefined2 *)((long)input[0x17] + 6);
  auVar50._12_4_ = auVar326._12_4_;
  auVar50._0_10_ = alVar1._0_10_;
  auVar50._10_2_ = *(undefined2 *)((long)input[0x17] + 4);
  auVar170._10_6_ = auVar50._10_6_;
  auVar170._0_8_ = alVar1[0];
  auVar170._8_2_ = alVar1[0]._4_2_;
  auVar287._8_8_ = auVar170._8_8_;
  auVar287._6_2_ = *(undefined2 *)((long)input[0x17] + 2);
  auVar287._4_2_ = alVar1[0]._2_2_;
  auVar287._0_2_ = (undefined2)alVar1[0];
  auVar287._2_2_ = (short)input[0x17][0];
  auVar141._2_2_ = (short)input[0x17][1];
  auVar141._0_2_ = (short)alVar1[1];
  auVar141._4_2_ = alVar1[1]._2_2_;
  auVar141._6_2_ = *(undefined2 *)((long)input[0x17] + 10);
  auVar141._8_2_ = alVar1[1]._4_2_;
  auVar141._10_2_ = *(undefined2 *)((long)input[0x17] + 0xc);
  auVar141._12_2_ = alVar1[1]._6_2_;
  auVar141._14_2_ = *(undefined2 *)((long)input[0x17] + 0xe);
  auVar183._8_4_ = 0xf18906d7;
  auVar183._0_8_ = 0xf18906d7f18906d7;
  auVar183._12_4_ = 0xf18906d7;
  auVar284 = pmaddwd(auVar287,auVar183);
  auVar264 = pmaddwd(auVar183,auVar141);
  auVar218._8_4_ = 0x6d70e77;
  auVar218._0_8_ = 0x6d70e7706d70e77;
  auVar218._12_4_ = 0x6d70e77;
  auVar214 = pmaddwd(auVar287,auVar218);
  auVar306 = pmaddwd(auVar141,auVar218);
  auVar111._0_4_ = auVar284._0_4_ + 0x800 >> 0xc;
  auVar111._4_4_ = auVar284._4_4_ + 0x800 >> 0xc;
  auVar111._8_4_ = auVar284._8_4_ + 0x800 >> 0xc;
  auVar111._12_4_ = auVar284._12_4_ + 0x800 >> 0xc;
  auVar184._0_4_ = auVar264._0_4_ + 0x800 >> 0xc;
  auVar184._4_4_ = auVar264._4_4_ + 0x800 >> 0xc;
  auVar184._8_4_ = auVar264._8_4_ + 0x800 >> 0xc;
  auVar184._12_4_ = auVar264._12_4_ + 0x800 >> 0xc;
  auVar112 = packssdw(auVar111,auVar184);
  auVar313._0_4_ = auVar214._0_4_ + 0x800 >> 0xc;
  auVar313._4_4_ = auVar214._4_4_ + 0x800 >> 0xc;
  auVar313._8_4_ = auVar214._8_4_ + 0x800 >> 0xc;
  auVar313._12_4_ = auVar214._12_4_ + 0x800 >> 0xc;
  auVar142._0_4_ = auVar306._0_4_ + 0x800 >> 0xc;
  auVar142._4_4_ = auVar306._4_4_ + 0x800 >> 0xc;
  auVar142._8_4_ = auVar306._8_4_ + 0x800 >> 0xc;
  auVar142._12_4_ = auVar306._12_4_ + 0x800 >> 0xc;
  auVar214 = packssdw(auVar313,auVar142);
  auVar93._0_12_ = alVar2._0_12_;
  auVar93._12_2_ = alVar2[0]._6_2_;
  auVar93._14_2_ = *(undefined2 *)((long)input[7] + 6);
  auVar147._12_4_ = auVar93._12_4_;
  auVar147._0_10_ = alVar2._0_10_;
  auVar147._10_2_ = *(undefined2 *)((long)input[7] + 4);
  auVar118._10_6_ = auVar147._10_6_;
  auVar118._0_8_ = alVar2[0];
  auVar118._8_2_ = alVar2[0]._4_2_;
  auVar92._8_8_ = auVar118._8_8_;
  auVar92._6_2_ = *(undefined2 *)((long)input[7] + 2);
  auVar92._4_2_ = alVar2[0]._2_2_;
  auVar92._0_2_ = (undefined2)alVar2[0];
  auVar92._2_2_ = (short)input[7][0];
  auVar78._2_2_ = (short)input[7][1];
  auVar78._0_2_ = (short)alVar2[1];
  auVar78._4_2_ = alVar2[1]._2_2_;
  auVar78._6_2_ = *(undefined2 *)((long)input[7] + 10);
  auVar78._8_2_ = alVar2[1]._4_2_;
  auVar78._10_2_ = *(undefined2 *)((long)input[7] + 0xc);
  auVar78._12_2_ = alVar2[1]._6_2_;
  auVar78._14_2_ = *(undefined2 *)((long)input[7] + 0xe);
  auVar143._8_4_ = 0xfa9c0f11;
  auVar143._0_8_ = 0xfa9c0f11fa9c0f11;
  auVar143._12_4_ = 0xfa9c0f11;
  auVar306 = pmaddwd(auVar92,auVar143);
  auVar144 = pmaddwd(auVar143,auVar78);
  auVar185._8_4_ = 0xf110564;
  auVar185._0_8_ = 0xf1105640f110564;
  auVar185._12_4_ = 0xf110564;
  auVar284 = pmaddwd(auVar92,auVar185);
  auVar264 = pmaddwd(auVar78,auVar185);
  auVar13._0_4_ = auVar306._0_4_ + 0x800 >> 0xc;
  auVar13._4_4_ = auVar306._4_4_ + 0x800 >> 0xc;
  auVar13._8_4_ = auVar306._8_4_ + 0x800 >> 0xc;
  auVar13._12_4_ = auVar306._12_4_ + 0x800 >> 0xc;
  auVar145._0_4_ = auVar144._0_4_ + 0x800 >> 0xc;
  auVar145._4_4_ = auVar144._4_4_ + 0x800 >> 0xc;
  auVar145._8_4_ = auVar144._8_4_ + 0x800 >> 0xc;
  auVar145._12_4_ = auVar144._12_4_ + 0x800 >> 0xc;
  auVar14 = packssdw(auVar13,auVar145);
  auVar94._0_4_ = auVar284._0_4_ + 0x800 >> 0xc;
  auVar94._4_4_ = auVar284._4_4_ + 0x800 >> 0xc;
  auVar94._8_4_ = auVar284._8_4_ + 0x800 >> 0xc;
  auVar94._12_4_ = auVar284._12_4_ + 0x800 >> 0xc;
  auVar79._0_4_ = auVar264._0_4_ + 0x800 >> 0xc;
  auVar79._4_4_ = auVar264._4_4_ + 0x800 >> 0xc;
  auVar79._8_4_ = auVar264._8_4_ + 0x800 >> 0xc;
  auVar79._12_4_ = auVar264._12_4_ + 0x800 >> 0xc;
  auVar284 = packssdw(auVar94,auVar79);
  auVar270._0_12_ = alVar3._0_12_;
  auVar270._12_2_ = alVar3[0]._6_2_;
  auVar270._14_2_ = *(undefined2 *)((long)input[0x1b] + 6);
  auVar269._12_4_ = auVar270._12_4_;
  auVar269._0_10_ = alVar3._0_10_;
  auVar269._10_2_ = *(undefined2 *)((long)input[0x1b] + 4);
  auVar268._10_6_ = auVar269._10_6_;
  auVar268._0_8_ = alVar3[0];
  auVar268._8_2_ = alVar3[0]._4_2_;
  auVar267._8_8_ = auVar268._8_8_;
  auVar267._6_2_ = *(undefined2 *)((long)input[0x1b] + 2);
  auVar267._4_2_ = alVar3[0]._2_2_;
  auVar267._0_2_ = (undefined2)alVar3[0];
  auVar267._2_2_ = (short)input[0x1b][0];
  auVar42._2_2_ = (short)input[0x1b][1];
  auVar42._0_2_ = (short)alVar3[1];
  auVar42._4_2_ = alVar3[1]._2_2_;
  auVar42._6_2_ = *(undefined2 *)((long)input[0x1b] + 10);
  auVar42._8_2_ = alVar3[1]._4_2_;
  auVar42._10_2_ = *(undefined2 *)((long)input[0x1b] + 0xc);
  auVar42._12_2_ = alVar3[1]._6_2_;
  auVar42._14_2_ = *(undefined2 *)((long)input[0x1b] + 0xe);
  auVar80._8_4_ = 0xf07b03e3;
  auVar80._0_8_ = 0xf07b03e3f07b03e3;
  auVar80._12_4_ = 0xf07b03e3;
  auVar287 = pmaddwd(auVar267,auVar80);
  auVar264 = pmaddwd(auVar80,auVar42);
  auVar165._8_4_ = 0x3e30f85;
  auVar165._0_8_ = 0x3e30f8503e30f85;
  auVar165._12_4_ = 0x3e30f85;
  auVar144 = pmaddwd(auVar267,auVar165);
  auVar306 = pmaddwd(auVar42,auVar165);
  auVar288._0_4_ = auVar287._0_4_ + 0x800 >> 0xc;
  auVar288._4_4_ = auVar287._4_4_ + 0x800 >> 0xc;
  auVar288._8_4_ = auVar287._8_4_ + 0x800 >> 0xc;
  auVar288._12_4_ = auVar287._12_4_ + 0x800 >> 0xc;
  auVar81._0_4_ = auVar264._0_4_ + 0x800 >> 0xc;
  auVar81._4_4_ = auVar264._4_4_ + 0x800 >> 0xc;
  auVar81._8_4_ = auVar264._8_4_ + 0x800 >> 0xc;
  auVar81._12_4_ = auVar264._12_4_ + 0x800 >> 0xc;
  auVar289 = packssdw(auVar288,auVar81);
  auVar271._0_4_ = auVar144._0_4_ + 0x800 >> 0xc;
  auVar271._4_4_ = auVar144._4_4_ + 0x800 >> 0xc;
  auVar271._8_4_ = auVar144._8_4_ + 0x800 >> 0xc;
  auVar271._12_4_ = auVar144._12_4_ + 0x800 >> 0xc;
  auVar43._0_4_ = auVar306._0_4_ + 0x800 >> 0xc;
  auVar43._4_4_ = auVar306._4_4_ + 0x800 >> 0xc;
  auVar43._8_4_ = auVar306._8_4_ + 0x800 >> 0xc;
  auVar43._12_4_ = auVar306._12_4_ + 0x800 >> 0xc;
  auVar272 = packssdw(auVar271,auVar43);
  local_1d8 = (undefined2)lVar6;
  uStack_1d6 = (undefined2)((ulong)lVar6 >> 0x10);
  uStack_1d4 = (undefined2)((ulong)lVar6 >> 0x20);
  uStack_1d2 = (undefined2)((ulong)lVar6 >> 0x30);
  uStack_1d0 = (undefined2)lVar7;
  uStack_1ce = (undefined2)((ulong)lVar7 >> 0x10);
  uStack_1cc = (undefined2)((ulong)lVar7 >> 0x20);
  uStack_1ca = (undefined2)((ulong)lVar7 >> 0x30);
  auVar116._0_12_ = alVar4._0_12_;
  auVar116._12_2_ = alVar4[0]._6_2_;
  auVar116._14_2_ = uStack_1d2;
  auVar115._12_4_ = auVar116._12_4_;
  auVar115._0_10_ = alVar4._0_10_;
  auVar115._10_2_ = uStack_1d4;
  auVar114._10_6_ = auVar115._10_6_;
  auVar114._0_8_ = alVar4[0];
  auVar114._8_2_ = alVar4[0]._4_2_;
  auVar113._8_8_ = auVar114._8_8_;
  auVar113._6_2_ = uStack_1d6;
  auVar113._4_2_ = alVar4[0]._2_2_;
  auVar113._0_2_ = (undefined2)alVar4[0];
  auVar113._2_2_ = local_1d8;
  auVar197._2_2_ = uStack_1d0;
  auVar197._0_2_ = (short)alVar4[1];
  auVar197._4_2_ = alVar4[1]._2_2_;
  auVar197._6_2_ = uStack_1ce;
  auVar197._8_2_ = alVar4[1]._4_2_;
  auVar197._10_2_ = uStack_1cc;
  auVar197._12_2_ = alVar4[1]._6_2_;
  auVar197._14_2_ = uStack_1ca;
  auVar82._8_4_ = 0xf7c60db9;
  auVar82._0_8_ = 0xf7c60db9f7c60db9;
  auVar82._12_4_ = 0xf7c60db9;
  auVar306 = pmaddwd(auVar113,auVar82);
  auVar264 = pmaddwd(auVar82,auVar197);
  auVar15._8_4_ = 0xdb9083a;
  auVar15._0_8_ = 0xdb9083a0db9083a;
  auVar15._12_4_ = 0xdb9083a;
  auVar144 = pmaddwd(auVar113,auVar15);
  auVar287 = pmaddwd(auVar197,auVar15);
  alVar283 = input[0xd];
  auVar200._0_4_ = auVar306._0_4_ + 0x800 >> 0xc;
  auVar200._4_4_ = auVar306._4_4_ + 0x800 >> 0xc;
  auVar200._8_4_ = auVar306._8_4_ + 0x800 >> 0xc;
  auVar200._12_4_ = auVar306._12_4_ + 0x800 >> 0xc;
  auVar83._0_4_ = auVar264._0_4_ + 0x800 >> 0xc;
  auVar83._4_4_ = auVar264._4_4_ + 0x800 >> 0xc;
  auVar83._8_4_ = auVar264._8_4_ + 0x800 >> 0xc;
  auVar83._12_4_ = auVar264._12_4_ + 0x800 >> 0xc;
  auVar306 = packssdw(auVar200,auVar83);
  auVar117._0_4_ = auVar144._0_4_ + 0x800 >> 0xc;
  auVar117._4_4_ = auVar144._4_4_ + 0x800 >> 0xc;
  auVar117._8_4_ = auVar144._8_4_ + 0x800 >> 0xc;
  auVar117._12_4_ = auVar144._12_4_ + 0x800 >> 0xc;
  auVar198._0_4_ = auVar287._0_4_ + 0x800 >> 0xc;
  auVar198._4_4_ = auVar287._4_4_ + 0x800 >> 0xc;
  auVar198._8_4_ = auVar287._8_4_ + 0x800 >> 0xc;
  auVar198._12_4_ = auVar287._12_4_ + 0x800 >> 0xc;
  auVar118 = packssdw(auVar117,auVar198);
  auVar249._0_12_ = alVar283._0_12_;
  auVar249._12_2_ = alVar283[0]._6_2_;
  auVar249._14_2_ = *(undefined2 *)((long)input[0x13] + 6);
  auVar248._12_4_ = auVar249._12_4_;
  auVar248._0_10_ = alVar283._0_10_;
  auVar248._10_2_ = *(undefined2 *)((long)input[0x13] + 4);
  auVar247._10_6_ = auVar248._10_6_;
  auVar247._0_8_ = alVar283[0];
  auVar247._8_2_ = alVar283[0]._4_2_;
  auVar246._8_8_ = auVar247._8_8_;
  auVar246._6_2_ = *(undefined2 *)((long)input[0x13] + 2);
  auVar246._4_2_ = alVar283[0]._2_2_;
  auVar246._0_2_ = (undefined2)alVar283[0];
  auVar246._2_2_ = (short)input[0x13][0];
  auVar16._2_2_ = (short)input[0x13][1];
  auVar16._0_2_ = (short)alVar283[1];
  auVar16._4_2_ = alVar283[1]._2_2_;
  auVar16._6_2_ = *(undefined2 *)((long)input[0x13] + 10);
  auVar16._8_2_ = alVar283[1]._4_2_;
  auVar16._10_2_ = *(undefined2 *)((long)input[0x13] + 0xc);
  auVar16._12_2_ = alVar283[1]._6_2_;
  auVar16._14_2_ = *(undefined2 *)((long)input[0x13] + 0xe);
  auVar328._8_4_ = 0xf3260988;
  auVar328._0_8_ = 0xf3260988f3260988;
  auVar328._12_4_ = 0xf3260988;
  auVar326 = pmaddwd(auVar246,auVar328);
  auVar264 = pmaddwd(auVar328,auVar16);
  auVar84._8_4_ = 0x9880cda;
  auVar84._0_8_ = 0x9880cda09880cda;
  auVar84._12_4_ = 0x9880cda;
  auVar287 = pmaddwd(auVar246,auVar84);
  auVar144 = pmaddwd(auVar16,auVar84);
  auVar327._0_4_ = auVar326._0_4_ + 0x800 >> 0xc;
  auVar327._4_4_ = auVar326._4_4_ + 0x800 >> 0xc;
  auVar327._8_4_ = auVar326._8_4_ + 0x800 >> 0xc;
  auVar327._12_4_ = auVar326._12_4_ + 0x800 >> 0xc;
  auVar251._0_4_ = auVar264._0_4_ + 0x800 >> 0xc;
  auVar251._4_4_ = auVar264._4_4_ + 0x800 >> 0xc;
  auVar251._8_4_ = auVar264._8_4_ + 0x800 >> 0xc;
  auVar251._12_4_ = auVar264._12_4_ + 0x800 >> 0xc;
  auVar328 = packssdw(auVar327,auVar251);
  auVar250._0_4_ = auVar287._0_4_ + 0x800 >> 0xc;
  auVar250._4_4_ = auVar287._4_4_ + 0x800 >> 0xc;
  auVar250._8_4_ = auVar287._8_4_ + 0x800 >> 0xc;
  auVar250._12_4_ = auVar287._12_4_ + 0x800 >> 0xc;
  auVar17._0_4_ = auVar144._0_4_ + 0x800 >> 0xc;
  auVar17._4_4_ = auVar144._4_4_ + 0x800 >> 0xc;
  auVar17._8_4_ = auVar144._8_4_ + 0x800 >> 0xc;
  auVar17._12_4_ = auVar144._12_4_ + 0x800 >> 0xc;
  auVar251 = packssdw(auVar250,auVar17);
  alVar283 = input[0x1d];
  auVar47._0_12_ = alVar283._0_12_;
  auVar47._12_2_ = alVar283[0]._6_2_;
  auVar47._14_2_ = *(undefined2 *)((long)input[3] + 6);
  auVar46._12_4_ = auVar47._12_4_;
  auVar46._0_10_ = alVar283._0_10_;
  auVar46._10_2_ = *(undefined2 *)((long)input[3] + 4);
  auVar45._10_6_ = auVar46._10_6_;
  auVar45._0_8_ = alVar283[0];
  auVar45._8_2_ = alVar283[0]._4_2_;
  auVar44._8_8_ = auVar45._8_8_;
  auVar44._6_2_ = *(undefined2 *)((long)input[3] + 2);
  auVar44._4_2_ = alVar283[0]._2_2_;
  auVar44._0_2_ = (undefined2)alVar283[0];
  auVar44._2_2_ = (short)input[3][0];
  auVar95._2_2_ = (short)input[3][1];
  auVar95._0_2_ = (short)alVar283[1];
  auVar95._4_2_ = alVar283[1]._2_2_;
  auVar95._6_2_ = *(undefined2 *)((long)input[3] + 10);
  auVar95._8_2_ = alVar283[1]._4_2_;
  auVar95._10_2_ = *(undefined2 *)((long)input[3] + 0xc);
  auVar95._12_2_ = alVar283[1]._6_2_;
  auVar95._14_2_ = *(undefined2 *)((long)input[3] + 0xe);
  auVar18._8_4_ = 0xfda70fd4;
  auVar18._0_8_ = 0xfda70fd4fda70fd4;
  auVar18._12_4_ = 0xfda70fd4;
  auVar326 = pmaddwd(auVar44,auVar18);
  auVar144 = pmaddwd(auVar18,auVar95);
  auVar85._8_4_ = 0xfd40259;
  auVar85._0_8_ = 0xfd402590fd40259;
  auVar85._12_4_ = 0xfd40259;
  auVar287 = pmaddwd(auVar44,auVar85);
  auVar264 = pmaddwd(auVar95,auVar85);
  auVar199._0_4_ = auVar326._0_4_ + 0x800 >> 0xc;
  auVar199._4_4_ = auVar326._4_4_ + 0x800 >> 0xc;
  auVar199._8_4_ = auVar326._8_4_ + 0x800 >> 0xc;
  auVar199._12_4_ = auVar326._12_4_ + 0x800 >> 0xc;
  auVar19._0_4_ = auVar144._0_4_ + 0x800 >> 0xc;
  auVar19._4_4_ = auVar144._4_4_ + 0x800 >> 0xc;
  auVar19._8_4_ = auVar144._8_4_ + 0x800 >> 0xc;
  auVar19._12_4_ = auVar144._12_4_ + 0x800 >> 0xc;
  auVar200 = packssdw(auVar199,auVar19);
  auVar48._0_4_ = auVar287._0_4_ + 0x800 >> 0xc;
  auVar48._4_4_ = auVar287._4_4_ + 0x800 >> 0xc;
  auVar48._8_4_ = auVar287._8_4_ + 0x800 >> 0xc;
  auVar48._12_4_ = auVar287._12_4_ + 0x800 >> 0xc;
  auVar98._0_4_ = auVar264._0_4_ + 0x800 >> 0xc;
  auVar98._4_4_ = auVar264._4_4_ + 0x800 >> 0xc;
  auVar98._8_4_ = auVar264._8_4_ + 0x800 >> 0xc;
  auVar98._12_4_ = auVar264._12_4_ + 0x800 >> 0xc;
  auVar326 = packssdw(auVar48,auVar98);
  alVar283 = input[2];
  auVar169._0_12_ = alVar283._0_12_;
  auVar169._12_2_ = alVar283[0]._6_2_;
  auVar169._14_2_ = *(undefined2 *)((long)input[0x1e] + 6);
  auVar168._12_4_ = auVar169._12_4_;
  auVar168._0_10_ = alVar283._0_10_;
  auVar168._10_2_ = *(undefined2 *)((long)input[0x1e] + 4);
  auVar167._10_6_ = auVar168._10_6_;
  auVar167._0_8_ = alVar283[0];
  auVar167._8_2_ = alVar283[0]._4_2_;
  auVar166._8_8_ = auVar167._8_8_;
  auVar166._6_2_ = *(undefined2 *)((long)input[0x1e] + 2);
  auVar166._4_2_ = alVar283[0]._2_2_;
  auVar166._0_2_ = (undefined2)alVar283[0];
  auVar166._2_2_ = (short)input[0x1e][0];
  auVar99._2_2_ = (short)input[0x1e][1];
  auVar99._0_2_ = (short)alVar283[1];
  auVar99._4_2_ = alVar283[1]._2_2_;
  auVar99._6_2_ = *(undefined2 *)((long)input[0x1e] + 10);
  auVar99._8_2_ = alVar283[1]._4_2_;
  auVar99._10_2_ = *(undefined2 *)((long)input[0x1e] + 0xc);
  auVar99._12_2_ = alVar283[1]._6_2_;
  auVar99._14_2_ = *(undefined2 *)((long)input[0x1e] + 0xe);
  auVar20._8_4_ = 0xf0140191;
  auVar20._0_8_ = 0xf0140191f0140191;
  auVar20._12_4_ = 0xf0140191;
  auVar287 = pmaddwd(auVar166,auVar20);
  auVar144 = pmaddwd(auVar20,auVar99);
  auVar86._8_4_ = 0x1910fec;
  auVar86._0_8_ = 0x1910fec01910fec;
  auVar86._12_4_ = 0x1910fec;
  auVar170 = pmaddwd(auVar166,auVar86);
  auVar264 = pmaddwd(auVar99,auVar86);
  auVar49._0_4_ = auVar287._0_4_ + 0x800 >> 0xc;
  auVar49._4_4_ = auVar287._4_4_ + 0x800 >> 0xc;
  auVar49._8_4_ = auVar287._8_4_ + 0x800 >> 0xc;
  auVar49._12_4_ = auVar287._12_4_ + 0x800 >> 0xc;
  auVar21._0_4_ = auVar144._0_4_ + 0x800 >> 0xc;
  auVar21._4_4_ = auVar144._4_4_ + 0x800 >> 0xc;
  auVar21._8_4_ = auVar144._8_4_ + 0x800 >> 0xc;
  auVar21._12_4_ = auVar144._12_4_ + 0x800 >> 0xc;
  auVar50 = packssdw(auVar49,auVar21);
  auVar171._0_4_ = auVar170._0_4_ + 0x800 >> 0xc;
  auVar171._4_4_ = auVar170._4_4_ + 0x800 >> 0xc;
  auVar171._8_4_ = auVar170._8_4_ + 0x800 >> 0xc;
  auVar171._12_4_ = auVar170._12_4_ + 0x800 >> 0xc;
  auVar120._0_4_ = auVar264._0_4_ + 0x800 >> 0xc;
  auVar120._4_4_ = auVar264._4_4_ + 0x800 >> 0xc;
  auVar120._8_4_ = auVar264._8_4_ + 0x800 >> 0xc;
  auVar120._12_4_ = auVar264._12_4_ + 0x800 >> 0xc;
  auVar172 = packssdw(auVar171,auVar120);
  alVar283 = input[0x12];
  auVar222._0_12_ = alVar283._0_12_;
  auVar222._12_2_ = alVar283[0]._6_2_;
  auVar222._14_2_ = *(undefined2 *)((long)input[0xe] + 6);
  auVar221._12_4_ = auVar222._12_4_;
  auVar221._0_10_ = alVar283._0_10_;
  auVar221._10_2_ = *(undefined2 *)((long)input[0xe] + 4);
  auVar220._10_6_ = auVar221._10_6_;
  auVar220._0_8_ = alVar283[0];
  auVar220._8_2_ = alVar283[0]._4_2_;
  auVar219._8_8_ = auVar220._8_8_;
  auVar219._6_2_ = *(undefined2 *)((long)input[0xe] + 2);
  auVar219._4_2_ = alVar283[0]._2_2_;
  auVar219._0_2_ = (undefined2)alVar283[0];
  auVar219._2_2_ = (short)input[0xe][0];
  auVar119._2_2_ = (short)input[0xe][1];
  auVar119._0_2_ = (short)alVar283[1];
  auVar119._4_2_ = alVar283[1]._2_2_;
  auVar119._6_2_ = *(undefined2 *)((long)input[0xe] + 10);
  auVar119._8_2_ = alVar283[1]._4_2_;
  auVar119._10_2_ = *(undefined2 *)((long)input[0xe] + 0xc);
  auVar119._12_2_ = alVar283[1]._6_2_;
  auVar119._14_2_ = *(undefined2 *)((long)input[0xe] + 0xe);
  auVar22._8_4_ = 0xf5da0c5e;
  auVar22._0_8_ = 0xf5da0c5ef5da0c5e;
  auVar22._12_4_ = 0xf5da0c5e;
  auVar287 = pmaddwd(auVar219,auVar22);
  auVar144 = pmaddwd(auVar22,auVar119);
  auVar186._8_4_ = 0xc5e0a26;
  auVar186._0_8_ = 0xc5e0a260c5e0a26;
  auVar186._12_4_ = 0xc5e0a26;
  auVar170 = pmaddwd(auVar219,auVar186);
  auVar264 = pmaddwd(auVar119,auVar186);
  auVar146._0_4_ = auVar287._0_4_ + 0x800 >> 0xc;
  auVar146._4_4_ = auVar287._4_4_ + 0x800 >> 0xc;
  auVar146._8_4_ = auVar287._8_4_ + 0x800 >> 0xc;
  auVar146._12_4_ = auVar287._12_4_ + 0x800 >> 0xc;
  auVar23._0_4_ = auVar144._0_4_ + 0x800 >> 0xc;
  auVar23._4_4_ = auVar144._4_4_ + 0x800 >> 0xc;
  auVar23._8_4_ = auVar144._8_4_ + 0x800 >> 0xc;
  auVar23._12_4_ = auVar144._12_4_ + 0x800 >> 0xc;
  auVar147 = packssdw(auVar146,auVar23);
  auVar223._0_4_ = auVar170._0_4_ + 0x800 >> 0xc;
  auVar223._4_4_ = auVar170._4_4_ + 0x800 >> 0xc;
  auVar223._8_4_ = auVar170._8_4_ + 0x800 >> 0xc;
  auVar223._12_4_ = auVar170._12_4_ + 0x800 >> 0xc;
  auVar224._0_4_ = auVar264._0_4_ + 0x800 >> 0xc;
  auVar224._4_4_ = auVar264._4_4_ + 0x800 >> 0xc;
  auVar224._8_4_ = auVar264._8_4_ + 0x800 >> 0xc;
  auVar224._12_4_ = auVar264._12_4_ + 0x800 >> 0xc;
  auVar224 = packssdw(auVar223,auVar224);
  alVar283 = input[10];
  auVar312._0_12_ = alVar283._0_12_;
  auVar312._12_2_ = alVar283[0]._6_2_;
  auVar312._14_2_ = *(undefined2 *)((long)input[0x16] + 6);
  auVar311._12_4_ = auVar312._12_4_;
  auVar311._0_10_ = alVar283._0_10_;
  auVar311._10_2_ = *(undefined2 *)((long)input[0x16] + 4);
  auVar310._10_6_ = auVar311._10_6_;
  auVar310._0_8_ = alVar283[0];
  auVar310._8_2_ = alVar283[0]._4_2_;
  auVar309._8_8_ = auVar310._8_8_;
  auVar309._6_2_ = *(undefined2 *)((long)input[0x16] + 2);
  auVar309._4_2_ = alVar283[0]._2_2_;
  auVar309._0_2_ = (undefined2)alVar283[0];
  auVar309._2_2_ = (short)input[0x16][0];
  auVar191._2_2_ = (short)input[0x16][1];
  auVar191._0_2_ = (short)alVar283[1];
  auVar191._4_2_ = alVar283[1]._2_2_;
  auVar191._6_2_ = *(undefined2 *)((long)input[0x16] + 10);
  auVar191._8_2_ = alVar283[1]._4_2_;
  auVar191._10_2_ = *(undefined2 *)((long)input[0x16] + 0xc);
  auVar191._12_2_ = alVar283[1]._6_2_;
  auVar191._14_2_ = *(undefined2 *)((long)input[0x16] + 0xe);
  auVar187._8_4_ = 0xf1e4078b;
  auVar187._0_8_ = 0xf1e4078bf1e4078b;
  auVar187._12_4_ = 0xf1e4078b;
  auVar144 = pmaddwd(auVar309,auVar187);
  auVar287 = pmaddwd(auVar187,auVar191);
  auVar225._8_4_ = 0x78b0e1c;
  auVar225._0_8_ = 0x78b0e1c078b0e1c;
  auVar225._12_4_ = 0x78b0e1c;
  auVar313 = pmaddwd(auVar309,auVar225);
  auVar264 = pmaddwd(auVar191,auVar225);
  auVar51._0_4_ = auVar144._0_4_ + 0x800 >> 0xc;
  auVar51._4_4_ = auVar144._4_4_ + 0x800 >> 0xc;
  auVar51._8_4_ = auVar144._8_4_ + 0x800 >> 0xc;
  auVar51._12_4_ = auVar144._12_4_ + 0x800 >> 0xc;
  auVar188._0_4_ = auVar287._0_4_ + 0x800 >> 0xc;
  auVar188._4_4_ = auVar287._4_4_ + 0x800 >> 0xc;
  auVar188._8_4_ = auVar287._8_4_ + 0x800 >> 0xc;
  auVar188._12_4_ = auVar287._12_4_ + 0x800 >> 0xc;
  auVar170 = packssdw(auVar51,auVar188);
  auVar314._0_4_ = auVar313._0_4_ + 0x800 >> 0xc;
  auVar314._4_4_ = auVar313._4_4_ + 0x800 >> 0xc;
  auVar314._8_4_ = auVar313._8_4_ + 0x800 >> 0xc;
  auVar314._12_4_ = auVar313._12_4_ + 0x800 >> 0xc;
  auVar273._0_4_ = auVar264._0_4_ + 0x800 >> 0xc;
  auVar273._4_4_ = auVar264._4_4_ + 0x800 >> 0xc;
  auVar273._8_4_ = auVar264._8_4_ + 0x800 >> 0xc;
  auVar273._12_4_ = auVar264._12_4_ + 0x800 >> 0xc;
  auVar315 = packssdw(auVar314,auVar273);
  alVar283 = input[0x1a];
  auVar90._0_12_ = alVar283._0_12_;
  auVar90._12_2_ = alVar283[0]._6_2_;
  auVar90._14_2_ = *(undefined2 *)((long)input[6] + 6);
  auVar89._12_4_ = auVar90._12_4_;
  auVar89._0_10_ = alVar283._0_10_;
  auVar89._10_2_ = *(undefined2 *)((long)input[6] + 4);
  auVar88._10_6_ = auVar89._10_6_;
  auVar88._0_8_ = alVar283[0];
  auVar88._8_2_ = alVar283[0]._4_2_;
  auVar87._8_8_ = auVar88._8_8_;
  auVar87._6_2_ = *(undefined2 *)((long)input[6] + 2);
  auVar87._4_2_ = alVar283[0]._2_2_;
  auVar87._0_2_ = (undefined2)alVar283[0];
  auVar87._2_2_ = (short)input[6][0];
  auVar153._2_2_ = (short)input[6][1];
  auVar153._0_2_ = (short)alVar283[1];
  auVar153._4_2_ = alVar283[1]._2_2_;
  auVar153._6_2_ = *(undefined2 *)((long)input[6] + 10);
  auVar153._8_2_ = alVar283[1]._4_2_;
  auVar153._10_2_ = *(undefined2 *)((long)input[6] + 0xc);
  auVar153._12_2_ = alVar283[1]._6_2_;
  auVar153._14_2_ = *(undefined2 *)((long)input[6] + 0xe);
  auVar189._8_4_ = 0xfb5b0f50;
  auVar189._0_8_ = 0xfb5b0f50fb5b0f50;
  auVar189._12_4_ = 0xfb5b0f50;
  auVar144 = pmaddwd(auVar87,auVar189);
  auVar287 = pmaddwd(auVar189,auVar153);
  auVar226._8_4_ = 0xf5004a5;
  auVar226._0_8_ = 0xf5004a50f5004a5;
  auVar226._12_4_ = 0xf5004a5;
  auVar313 = pmaddwd(auVar87,auVar226);
  auVar264 = pmaddwd(auVar153,auVar226);
  auVar24._0_4_ = auVar144._0_4_ + 0x800 >> 0xc;
  auVar24._4_4_ = auVar144._4_4_ + 0x800 >> 0xc;
  auVar24._8_4_ = auVar144._8_4_ + 0x800 >> 0xc;
  auVar24._12_4_ = auVar144._12_4_ + 0x800 >> 0xc;
  auVar190._0_4_ = auVar287._0_4_ + 0x800 >> 0xc;
  auVar190._4_4_ = auVar287._4_4_ + 0x800 >> 0xc;
  auVar190._8_4_ = auVar287._8_4_ + 0x800 >> 0xc;
  auVar190._12_4_ = auVar287._12_4_ + 0x800 >> 0xc;
  auVar287 = packssdw(auVar24,auVar190);
  auVar91._0_4_ = auVar313._0_4_ + 0x800 >> 0xc;
  auVar91._4_4_ = auVar313._4_4_ + 0x800 >> 0xc;
  auVar91._8_4_ = auVar313._8_4_ + 0x800 >> 0xc;
  auVar91._12_4_ = auVar313._12_4_ + 0x800 >> 0xc;
  auVar201._0_4_ = auVar264._0_4_ + 0x800 >> 0xc;
  auVar201._4_4_ = auVar264._4_4_ + 0x800 >> 0xc;
  auVar201._8_4_ = auVar264._8_4_ + 0x800 >> 0xc;
  auVar201._12_4_ = auVar264._12_4_ + 0x800 >> 0xc;
  auVar92 = packssdw(auVar91,auVar201);
  auVar93 = paddsw(auVar286,auVar266);
  auVar264 = psubsw(auVar286,auVar266);
  auVar144 = psubsw(auVar14,auVar112);
  auVar14 = paddsw(auVar14,auVar112);
  auVar94 = paddsw(auVar289,auVar306);
  auVar266 = psubsw(auVar289,auVar306);
  auVar201 = psubsw(auVar200,auVar328);
  auVar200 = paddsw(auVar200,auVar328);
  auVar328 = paddsw(auVar326,auVar251);
  auVar191 = psubsw(auVar326,auVar251);
  auVar326 = psubsw(auVar272,auVar118);
  auVar119 = paddsw(auVar118,auVar272);
  auVar251 = paddsw(auVar284,auVar214);
  auVar120 = psubsw(auVar284,auVar214);
  auVar273 = psubsw(auVar308,auVar8);
  auVar95 = paddsw(auVar8,auVar308);
  alVar283 = input[4];
  auVar332._0_12_ = alVar283._0_12_;
  auVar332._12_2_ = alVar283[0]._6_2_;
  auVar332._14_2_ = *(undefined2 *)((long)input[0x1c] + 6);
  auVar331._12_4_ = auVar332._12_4_;
  auVar331._0_10_ = alVar283._0_10_;
  auVar331._10_2_ = *(undefined2 *)((long)input[0x1c] + 4);
  auVar330._10_6_ = auVar331._10_6_;
  auVar330._0_8_ = alVar283[0];
  auVar330._8_2_ = alVar283[0]._4_2_;
  auVar329._8_8_ = auVar330._8_8_;
  auVar329._6_2_ = *(undefined2 *)((long)input[0x1c] + 2);
  auVar329._4_2_ = alVar283[0]._2_2_;
  auVar329._0_2_ = (undefined2)alVar283[0];
  auVar329._2_2_ = (short)input[0x1c][0];
  auVar121._2_2_ = (short)input[0x1c][1];
  auVar121._0_2_ = (short)alVar283[1];
  auVar121._4_2_ = alVar283[1]._2_2_;
  auVar121._6_2_ = *(undefined2 *)((long)input[0x1c] + 10);
  auVar121._8_2_ = alVar283[1]._4_2_;
  auVar121._10_2_ = *(undefined2 *)((long)input[0x1c] + 0xc);
  auVar121._12_2_ = alVar283[1]._6_2_;
  auVar121._14_2_ = *(undefined2 *)((long)input[0x1c] + 0xe);
  auVar227._8_4_ = 0xf04f031f;
  auVar227._0_8_ = 0xf04f031ff04f031f;
  auVar227._12_4_ = 0xf04f031f;
  auVar8 = pmaddwd(auVar329,auVar227);
  auVar284 = pmaddwd(auVar227,auVar121);
  auVar252._8_4_ = 0x31f0fb1;
  auVar252._0_8_ = 0x31f0fb1031f0fb1;
  auVar252._12_4_ = 0x31f0fb1;
  auVar306 = pmaddwd(auVar329,auVar252);
  auVar214 = pmaddwd(auVar121,auVar252);
  auVar96._0_4_ = auVar8._0_4_ + 0x800 >> 0xc;
  auVar96._4_4_ = auVar8._4_4_ + 0x800 >> 0xc;
  auVar96._8_4_ = auVar8._8_4_ + 0x800 >> 0xc;
  auVar96._12_4_ = auVar8._12_4_ + 0x800 >> 0xc;
  auVar228._0_4_ = auVar284._0_4_ + 0x800 >> 0xc;
  auVar228._4_4_ = auVar284._4_4_ + 0x800 >> 0xc;
  auVar228._8_4_ = auVar284._8_4_ + 0x800 >> 0xc;
  auVar228._12_4_ = auVar284._12_4_ + 0x800 >> 0xc;
  auVar118 = packssdw(auVar96,auVar228);
  auVar333._0_4_ = auVar306._0_4_ + 0x800 >> 0xc;
  auVar333._4_4_ = auVar306._4_4_ + 0x800 >> 0xc;
  auVar333._8_4_ = auVar306._8_4_ + 0x800 >> 0xc;
  auVar333._12_4_ = auVar306._12_4_ + 0x800 >> 0xc;
  auVar122._0_4_ = auVar214._0_4_ + 0x800 >> 0xc;
  auVar122._4_4_ = auVar214._4_4_ + 0x800 >> 0xc;
  auVar122._8_4_ = auVar214._8_4_ + 0x800 >> 0xc;
  auVar122._12_4_ = auVar214._12_4_ + 0x800 >> 0xc;
  auVar334 = packssdw(auVar333,auVar122);
  alVar283 = input[0x14];
  auVar232._0_12_ = alVar283._0_12_;
  auVar232._12_2_ = alVar283[0]._6_2_;
  auVar232._14_2_ = *(undefined2 *)((long)input[0xc] + 6);
  auVar231._12_4_ = auVar232._12_4_;
  auVar231._0_10_ = alVar283._0_10_;
  auVar231._10_2_ = *(undefined2 *)((long)input[0xc] + 4);
  auVar230._10_6_ = auVar231._10_6_;
  auVar230._0_8_ = alVar283[0];
  auVar230._8_2_ = alVar283[0]._4_2_;
  auVar229._8_8_ = auVar230._8_8_;
  auVar229._6_2_ = *(undefined2 *)((long)input[0xc] + 2);
  auVar229._4_2_ = alVar283[0]._2_2_;
  auVar229._0_2_ = (undefined2)alVar283[0];
  auVar229._2_2_ = (short)input[0xc][0];
  auVar123._2_2_ = (short)input[0xc][1];
  auVar123._0_2_ = (short)alVar283[1];
  auVar123._4_2_ = alVar283[1]._2_2_;
  auVar123._6_2_ = *(undefined2 *)((long)input[0xc] + 10);
  auVar123._8_2_ = alVar283[1]._4_2_;
  auVar123._10_2_ = *(undefined2 *)((long)input[0xc] + 0xc);
  auVar123._12_2_ = alVar283[1]._6_2_;
  auVar123._14_2_ = *(undefined2 *)((long)input[0xc] + 0xe);
  auVar253._8_4_ = 0xf71c0d4e;
  auVar253._0_8_ = 0xf71c0d4ef71c0d4e;
  auVar253._12_4_ = 0xf71c0d4e;
  auVar8 = pmaddwd(auVar229,auVar253);
  auVar306 = pmaddwd(auVar253,auVar123);
  auVar335._8_4_ = 0xd4e08e4;
  auVar335._0_8_ = 0xd4e08e40d4e08e4;
  auVar335._12_4_ = 0xd4e08e4;
  auVar284 = pmaddwd(auVar229,auVar335);
  auVar214 = pmaddwd(auVar123,auVar335);
  auVar97._0_4_ = auVar8._0_4_ + 0x800 >> 0xc;
  auVar97._4_4_ = auVar8._4_4_ + 0x800 >> 0xc;
  auVar97._8_4_ = auVar8._8_4_ + 0x800 >> 0xc;
  auVar97._12_4_ = auVar8._12_4_ + 0x800 >> 0xc;
  auVar254._0_4_ = auVar306._0_4_ + 0x800 >> 0xc;
  auVar254._4_4_ = auVar306._4_4_ + 0x800 >> 0xc;
  auVar254._8_4_ = auVar306._8_4_ + 0x800 >> 0xc;
  auVar254._12_4_ = auVar306._12_4_ + 0x800 >> 0xc;
  auVar98 = packssdw(auVar97,auVar254);
  auVar233._0_4_ = auVar284._0_4_ + 0x800 >> 0xc;
  auVar233._4_4_ = auVar284._4_4_ + 0x800 >> 0xc;
  auVar233._8_4_ = auVar284._8_4_ + 0x800 >> 0xc;
  auVar233._12_4_ = auVar284._12_4_ + 0x800 >> 0xc;
  auVar124._0_4_ = auVar214._0_4_ + 0x800 >> 0xc;
  auVar124._4_4_ = auVar214._4_4_ + 0x800 >> 0xc;
  auVar124._8_4_ = auVar214._8_4_ + 0x800 >> 0xc;
  auVar124._12_4_ = auVar214._12_4_ + 0x800 >> 0xc;
  auVar308 = packssdw(auVar233,auVar124);
  auVar99 = paddsw(auVar50,auVar147);
  auVar50 = psubsw(auVar50,auVar147);
  auVar255 = psubsw(auVar287,auVar170);
  auVar313 = paddsw(auVar287,auVar170);
  auVar147 = paddsw(auVar92,auVar315);
  auVar284 = psubsw(auVar92,auVar315);
  auVar306 = psubsw(auVar172,auVar224);
  auVar92 = paddsw(auVar224,auVar172);
  auVar128._0_12_ = auVar264._0_12_;
  auVar128._12_2_ = auVar264._6_2_;
  auVar128._14_2_ = auVar273._6_2_;
  auVar127._12_4_ = auVar128._12_4_;
  auVar127._0_10_ = auVar264._0_10_;
  auVar127._10_2_ = auVar273._4_2_;
  auVar126._10_6_ = auVar127._10_6_;
  auVar126._0_8_ = auVar264._0_8_;
  auVar126._8_2_ = auVar264._4_2_;
  auVar125._8_8_ = auVar126._8_8_;
  auVar125._6_2_ = auVar273._2_2_;
  auVar125._4_2_ = auVar264._2_2_;
  auVar125._0_2_ = auVar264._0_2_;
  auVar125._2_2_ = auVar273._0_2_;
  auVar52._2_2_ = auVar273._8_2_;
  auVar52._0_2_ = auVar264._8_2_;
  auVar52._4_2_ = auVar264._10_2_;
  auVar52._6_2_ = auVar273._10_2_;
  auVar52._8_2_ = auVar264._12_2_;
  auVar52._10_2_ = auVar273._12_2_;
  auVar52._12_2_ = auVar264._14_2_;
  auVar52._14_2_ = auVar273._14_2_;
  auVar25._8_4_ = 0xfb1031f;
  auVar25._0_8_ = 0xfb1031f0fb1031f;
  auVar25._12_4_ = 0xfb1031f;
  auVar264 = pmaddwd(auVar125,auVar25);
  auVar8 = pmaddwd(auVar52,auVar25);
  auVar26._8_4_ = 0x31ff04f;
  auVar26._0_8_ = 0x31ff04f031ff04f;
  auVar26._12_4_ = 0x31ff04f;
  auVar287 = pmaddwd(auVar125,auVar26);
  auVar214 = pmaddwd(auVar52,auVar26);
  auVar316._0_4_ = auVar287._0_4_ + 0x800 >> 0xc;
  auVar316._4_4_ = auVar287._4_4_ + 0x800 >> 0xc;
  auVar316._8_4_ = auVar287._8_4_ + 0x800 >> 0xc;
  auVar316._12_4_ = auVar287._12_4_ + 0x800 >> 0xc;
  auVar100._0_4_ = auVar214._0_4_ + 0x800 >> 0xc;
  auVar100._4_4_ = auVar214._4_4_ + 0x800 >> 0xc;
  auVar100._8_4_ = auVar214._8_4_ + 0x800 >> 0xc;
  auVar100._12_4_ = auVar214._12_4_ + 0x800 >> 0xc;
  auVar317 = packssdw(auVar316,auVar100);
  auVar129._0_4_ = auVar264._0_4_ + 0x800 >> 0xc;
  auVar129._4_4_ = auVar264._4_4_ + 0x800 >> 0xc;
  auVar129._8_4_ = auVar264._8_4_ + 0x800 >> 0xc;
  auVar129._12_4_ = auVar264._12_4_ + 0x800 >> 0xc;
  auVar53._0_4_ = auVar8._0_4_ + 0x800 >> 0xc;
  auVar53._4_4_ = auVar8._4_4_ + 0x800 >> 0xc;
  auVar53._8_4_ = auVar8._8_4_ + 0x800 >> 0xc;
  auVar53._12_4_ = auVar8._12_4_ + 0x800 >> 0xc;
  auVar224 = packssdw(auVar129,auVar53);
  local_228 = auVar120._0_2_;
  uStack_226 = auVar120._2_2_;
  uStack_224 = auVar120._4_2_;
  uStack_222 = auVar120._6_2_;
  uStack_220 = auVar120._8_2_;
  uStack_21e = auVar120._10_2_;
  uStack_21c = auVar120._12_2_;
  uStack_21a = auVar120._14_2_;
  auVar151._0_12_ = auVar144._0_12_;
  auVar151._12_2_ = auVar144._6_2_;
  auVar151._14_2_ = uStack_222;
  auVar150._12_4_ = auVar151._12_4_;
  auVar150._0_10_ = auVar144._0_10_;
  auVar150._10_2_ = uStack_224;
  auVar149._10_6_ = auVar150._10_6_;
  auVar149._0_8_ = auVar144._0_8_;
  auVar149._8_2_ = auVar144._4_2_;
  auVar148._8_8_ = auVar149._8_8_;
  auVar148._6_2_ = uStack_226;
  auVar148._4_2_ = auVar144._2_2_;
  auVar148._0_2_ = auVar144._0_2_;
  auVar148._2_2_ = local_228;
  auVar112._2_2_ = uStack_220;
  auVar112._0_2_ = auVar144._8_2_;
  auVar112._4_2_ = auVar144._10_2_;
  auVar112._6_2_ = uStack_21e;
  auVar112._8_2_ = auVar144._12_2_;
  auVar112._10_2_ = uStack_21c;
  auVar112._12_2_ = auVar144._14_2_;
  auVar112._14_2_ = uStack_21a;
  auVar130._8_4_ = 0xf04ffce1;
  auVar130._0_8_ = 0xf04ffce1f04ffce1;
  auVar130._12_4_ = 0xf04ffce1;
  auVar214 = pmaddwd(auVar148,auVar130);
  auVar264 = pmaddwd(auVar130,auVar112);
  auVar144 = pmaddwd(auVar148,auVar26);
  auVar8 = pmaddwd(auVar112,auVar26);
  auVar54._0_4_ = auVar214._0_4_ + 0x800 >> 0xc;
  auVar54._4_4_ = auVar214._4_4_ + 0x800 >> 0xc;
  auVar54._8_4_ = auVar214._8_4_ + 0x800 >> 0xc;
  auVar54._12_4_ = auVar214._12_4_ + 0x800 >> 0xc;
  auVar131._0_4_ = auVar264._0_4_ + 0x800 >> 0xc;
  auVar131._4_4_ = auVar264._4_4_ + 0x800 >> 0xc;
  auVar131._8_4_ = auVar264._8_4_ + 0x800 >> 0xc;
  auVar131._12_4_ = auVar264._12_4_ + 0x800 >> 0xc;
  auVar264 = packssdw(auVar54,auVar131);
  auVar152._0_4_ = auVar144._0_4_ + 0x800 >> 0xc;
  auVar152._4_4_ = auVar144._4_4_ + 0x800 >> 0xc;
  auVar152._8_4_ = auVar144._8_4_ + 0x800 >> 0xc;
  auVar152._12_4_ = auVar144._12_4_ + 0x800 >> 0xc;
  auVar172._0_4_ = auVar8._0_4_ + 0x800 >> 0xc;
  auVar172._4_4_ = auVar8._4_4_ + 0x800 >> 0xc;
  auVar172._8_4_ = auVar8._8_4_ + 0x800 >> 0xc;
  auVar172._12_4_ = auVar8._12_4_ + 0x800 >> 0xc;
  auVar153 = packssdw(auVar152,auVar172);
  local_e8 = auVar326._0_2_;
  uStack_e6 = auVar326._2_2_;
  uStack_e4 = auVar326._4_2_;
  uStack_e2 = auVar326._6_2_;
  uStack_e0 = auVar326._8_2_;
  uStack_de = auVar326._10_2_;
  uStack_dc = auVar326._12_2_;
  uStack_da = auVar326._14_2_;
  auVar157._0_12_ = auVar266._0_12_;
  auVar157._12_2_ = auVar266._6_2_;
  auVar157._14_2_ = uStack_e2;
  auVar156._12_4_ = auVar157._12_4_;
  auVar156._0_10_ = auVar266._0_10_;
  auVar156._10_2_ = uStack_e4;
  auVar155._10_6_ = auVar156._10_6_;
  auVar155._0_8_ = auVar266._0_8_;
  auVar155._8_2_ = auVar266._4_2_;
  auVar154._8_8_ = auVar155._8_8_;
  auVar154._6_2_ = uStack_e6;
  auVar154._4_2_ = auVar266._2_2_;
  auVar154._0_2_ = auVar266._0_2_;
  auVar154._2_2_ = local_e8;
  auVar290._2_2_ = uStack_e0;
  auVar290._0_2_ = auVar266._8_2_;
  auVar290._4_2_ = auVar266._10_2_;
  auVar290._6_2_ = uStack_de;
  auVar290._8_2_ = auVar266._12_2_;
  auVar290._10_2_ = uStack_dc;
  auVar290._12_2_ = auVar266._14_2_;
  auVar290._14_2_ = uStack_da;
  auVar266._8_4_ = 0x8e40d4e;
  auVar266._0_8_ = 0x8e40d4e08e40d4e;
  auVar266._12_4_ = 0x8e40d4e;
  auVar214 = pmaddwd(auVar154,auVar266);
  auVar144 = pmaddwd(auVar290,auVar266);
  auVar272._8_4_ = 0xd4ef71c;
  auVar272._0_8_ = 0xd4ef71c0d4ef71c;
  auVar272._12_4_ = 0xd4ef71c;
  auVar287 = pmaddwd(auVar154,auVar272);
  auVar8 = pmaddwd(auVar290,auVar272);
  auVar336._0_4_ = auVar287._0_4_ + 0x800 >> 0xc;
  auVar336._4_4_ = auVar287._4_4_ + 0x800 >> 0xc;
  auVar336._8_4_ = auVar287._8_4_ + 0x800 >> 0xc;
  auVar336._12_4_ = auVar287._12_4_ + 0x800 >> 0xc;
  auVar27._0_4_ = auVar8._0_4_ + 0x800 >> 0xc;
  auVar27._4_4_ = auVar8._4_4_ + 0x800 >> 0xc;
  auVar27._8_4_ = auVar8._8_4_ + 0x800 >> 0xc;
  auVar27._12_4_ = auVar8._12_4_ + 0x800 >> 0xc;
  auVar337 = packssdw(auVar336,auVar27);
  auVar158._0_4_ = auVar214._0_4_ + 0x800 >> 0xc;
  auVar158._4_4_ = auVar214._4_4_ + 0x800 >> 0xc;
  auVar158._8_4_ = auVar214._8_4_ + 0x800 >> 0xc;
  auVar158._12_4_ = auVar214._12_4_ + 0x800 >> 0xc;
  auVar291._0_4_ = auVar144._0_4_ + 0x800 >> 0xc;
  auVar291._4_4_ = auVar144._4_4_ + 0x800 >> 0xc;
  auVar291._8_4_ = auVar144._8_4_ + 0x800 >> 0xc;
  auVar291._12_4_ = auVar144._12_4_ + 0x800 >> 0xc;
  auVar273 = packssdw(auVar158,auVar291);
  local_1f8 = auVar191._0_2_;
  uStack_1f6 = auVar191._2_2_;
  uStack_1f4 = auVar191._4_2_;
  uStack_1f2 = auVar191._6_2_;
  uStack_1f0 = auVar191._8_2_;
  uStack_1ee = auVar191._10_2_;
  uStack_1ec = auVar191._12_2_;
  uStack_1ea = auVar191._14_2_;
  auVar58._0_12_ = auVar201._0_12_;
  auVar58._12_2_ = auVar201._6_2_;
  auVar58._14_2_ = uStack_1f2;
  auVar57._12_4_ = auVar58._12_4_;
  auVar57._0_10_ = auVar201._0_10_;
  auVar57._10_2_ = uStack_1f4;
  auVar56._10_6_ = auVar57._10_6_;
  auVar56._0_8_ = auVar201._0_8_;
  auVar56._8_2_ = auVar201._4_2_;
  auVar55._8_8_ = auVar56._8_8_;
  auVar55._6_2_ = uStack_1f6;
  auVar55._4_2_ = auVar201._2_2_;
  auVar55._0_2_ = auVar201._0_2_;
  auVar55._2_2_ = local_1f8;
  auVar202._2_2_ = uStack_1f0;
  auVar202._0_2_ = auVar201._8_2_;
  auVar202._4_2_ = auVar201._10_2_;
  auVar202._6_2_ = uStack_1ee;
  auVar202._8_2_ = auVar201._12_2_;
  auVar202._10_2_ = uStack_1ec;
  auVar202._12_2_ = auVar201._14_2_;
  auVar202._14_2_ = uStack_1ea;
  auVar28._8_4_ = 0xf71cf2b2;
  auVar28._0_8_ = 0xf71cf2b2f71cf2b2;
  auVar28._12_4_ = 0xf71cf2b2;
  auVar144 = pmaddwd(auVar55,auVar28);
  auVar8 = pmaddwd(auVar28,auVar202);
  auVar214 = pmaddwd(auVar55,auVar272);
  auVar287 = pmaddwd(auVar202,auVar272);
  auVar132._0_4_ = auVar144._0_4_ + 0x800 >> 0xc;
  auVar132._4_4_ = auVar144._4_4_ + 0x800 >> 0xc;
  auVar132._8_4_ = auVar144._8_4_ + 0x800 >> 0xc;
  auVar132._12_4_ = auVar144._12_4_ + 0x800 >> 0xc;
  auVar29._0_4_ = auVar8._0_4_ + 0x800 >> 0xc;
  auVar29._4_4_ = auVar8._4_4_ + 0x800 >> 0xc;
  auVar29._8_4_ = auVar8._8_4_ + 0x800 >> 0xc;
  auVar29._12_4_ = auVar8._12_4_ + 0x800 >> 0xc;
  auVar144 = packssdw(auVar132,auVar29);
  auVar59._0_4_ = auVar214._0_4_ + 0x800 >> 0xc;
  auVar59._4_4_ = auVar214._4_4_ + 0x800 >> 0xc;
  auVar59._8_4_ = auVar214._8_4_ + 0x800 >> 0xc;
  auVar59._12_4_ = auVar214._12_4_ + 0x800 >> 0xc;
  auVar203._0_4_ = auVar287._0_4_ + 0x800 >> 0xc;
  auVar203._4_4_ = auVar287._4_4_ + 0x800 >> 0xc;
  auVar203._8_4_ = auVar287._8_4_ + 0x800 >> 0xc;
  auVar203._12_4_ = auVar287._12_4_ + 0x800 >> 0xc;
  auVar287 = packssdw(auVar59,auVar203);
  alVar283 = *input;
  auVar277._0_12_ = alVar283._0_12_;
  auVar277._12_2_ = alVar283[0]._6_2_;
  auVar277._14_2_ = *(undefined2 *)((long)input[0x10] + 6);
  auVar276._12_4_ = auVar277._12_4_;
  auVar276._0_10_ = alVar283._0_10_;
  auVar276._10_2_ = *(undefined2 *)((long)input[0x10] + 4);
  auVar275._10_6_ = auVar276._10_6_;
  auVar275._0_8_ = alVar283[0];
  auVar275._8_2_ = alVar283[0]._4_2_;
  auVar274._8_8_ = auVar275._8_8_;
  auVar274._6_2_ = *(undefined2 *)((long)input[0x10] + 2);
  auVar274._4_2_ = alVar283[0]._2_2_;
  auVar274._0_2_ = (undefined2)alVar283[0];
  auVar274._2_2_ = (short)input[0x10][0];
  auVar286._2_2_ = (short)input[0x10][1];
  auVar286._0_2_ = (short)alVar283[1];
  auVar286._4_2_ = alVar283[1]._2_2_;
  auVar286._6_2_ = *(undefined2 *)((long)input[0x10] + 10);
  auVar286._8_2_ = alVar283[1]._4_2_;
  auVar286._10_2_ = *(undefined2 *)((long)input[0x10] + 0xc);
  auVar286._12_2_ = alVar283[1]._6_2_;
  auVar286._14_2_ = *(undefined2 *)((long)input[0x10] + 0xe);
  auVar30._8_4_ = 0xf4b00b50;
  auVar30._0_8_ = 0xf4b00b50f4b00b50;
  auVar30._12_4_ = 0xf4b00b50;
  auVar326 = pmaddwd(auVar274,auVar30);
  auVar8 = pmaddwd(auVar286,auVar30);
  auVar31._8_4_ = 0xb500b50;
  auVar31._0_8_ = 0xb500b500b500b50;
  auVar31._12_4_ = 0xb500b50;
  auVar170 = pmaddwd(auVar274,auVar31);
  auVar214 = pmaddwd(auVar286,auVar31);
  auVar292._0_4_ = auVar170._0_4_ + 0x800 >> 0xc;
  auVar292._4_4_ = auVar170._4_4_ + 0x800 >> 0xc;
  auVar292._8_4_ = auVar170._8_4_ + 0x800 >> 0xc;
  auVar292._12_4_ = auVar170._12_4_ + 0x800 >> 0xc;
  auVar60._0_4_ = auVar214._0_4_ + 0x800 >> 0xc;
  auVar60._4_4_ = auVar214._4_4_ + 0x800 >> 0xc;
  auVar60._8_4_ = auVar214._8_4_ + 0x800 >> 0xc;
  auVar60._12_4_ = auVar214._12_4_ + 0x800 >> 0xc;
  auVar293 = packssdw(auVar292,auVar60);
  auVar278._0_4_ = auVar326._0_4_ + 0x800 >> 0xc;
  auVar278._4_4_ = auVar326._4_4_ + 0x800 >> 0xc;
  auVar278._8_4_ = auVar326._8_4_ + 0x800 >> 0xc;
  auVar278._12_4_ = auVar326._12_4_ + 0x800 >> 0xc;
  auVar289._0_4_ = auVar8._0_4_ + 0x800 >> 0xc;
  auVar289._4_4_ = auVar8._4_4_ + 0x800 >> 0xc;
  auVar289._8_4_ = auVar8._8_4_ + 0x800 >> 0xc;
  auVar289._12_4_ = auVar8._12_4_ + 0x800 >> 0xc;
  auVar286 = packssdw(auVar278,auVar289);
  alVar283 = input[8];
  auVar64._0_12_ = alVar283._0_12_;
  auVar64._12_2_ = alVar283[0]._6_2_;
  auVar64._14_2_ = *(undefined2 *)((long)input[0x18] + 6);
  auVar63._12_4_ = auVar64._12_4_;
  auVar63._0_10_ = alVar283._0_10_;
  auVar63._10_2_ = *(undefined2 *)((long)input[0x18] + 4);
  auVar62._10_6_ = auVar63._10_6_;
  auVar62._0_8_ = alVar283[0];
  auVar62._8_2_ = alVar283[0]._4_2_;
  auVar61._8_8_ = auVar62._8_8_;
  auVar61._6_2_ = *(undefined2 *)((long)input[0x18] + 2);
  auVar61._4_2_ = alVar283[0]._2_2_;
  auVar61._0_2_ = (undefined2)alVar283[0];
  auVar61._2_2_ = (short)input[0x18][0];
  auVar32._2_2_ = (short)input[0x18][1];
  auVar32._0_2_ = (short)alVar283[1];
  auVar32._4_2_ = alVar283[1]._2_2_;
  auVar32._6_2_ = *(undefined2 *)((long)input[0x18] + 10);
  auVar32._8_2_ = alVar283[1]._4_2_;
  auVar32._10_2_ = *(undefined2 *)((long)input[0x18] + 0xc);
  auVar32._12_2_ = alVar283[1]._6_2_;
  auVar32._14_2_ = *(undefined2 *)((long)input[0x18] + 0xe);
  auVar279._8_4_ = 0xf138061f;
  auVar279._0_8_ = 0xf138061ff138061f;
  auVar279._12_4_ = 0xf138061f;
  auVar326 = pmaddwd(auVar61,auVar279);
  auVar170 = pmaddwd(auVar279,auVar32);
  auVar294._8_4_ = 0x61f0ec8;
  auVar294._0_8_ = 0x61f0ec8061f0ec8;
  auVar294._12_4_ = 0x61f0ec8;
  auVar214 = pmaddwd(auVar61,auVar294);
  auVar8 = pmaddwd(auVar32,auVar294);
  auVar192._0_4_ = auVar326._0_4_ + 0x800 >> 0xc;
  auVar192._4_4_ = auVar326._4_4_ + 0x800 >> 0xc;
  auVar192._8_4_ = auVar326._8_4_ + 0x800 >> 0xc;
  auVar192._12_4_ = auVar326._12_4_ + 0x800 >> 0xc;
  auVar280._0_4_ = auVar170._0_4_ + 0x800 >> 0xc;
  auVar280._4_4_ = auVar170._4_4_ + 0x800 >> 0xc;
  auVar280._8_4_ = auVar170._8_4_ + 0x800 >> 0xc;
  auVar280._12_4_ = auVar170._12_4_ + 0x800 >> 0xc;
  auVar112 = packssdw(auVar192,auVar280);
  auVar65._0_4_ = auVar214._0_4_ + 0x800 >> 0xc;
  auVar65._4_4_ = auVar214._4_4_ + 0x800 >> 0xc;
  auVar65._8_4_ = auVar214._8_4_ + 0x800 >> 0xc;
  auVar65._12_4_ = auVar214._12_4_ + 0x800 >> 0xc;
  auVar33._0_4_ = auVar8._0_4_ + 0x800 >> 0xc;
  auVar33._4_4_ = auVar8._4_4_ + 0x800 >> 0xc;
  auVar33._8_4_ = auVar8._8_4_ + 0x800 >> 0xc;
  auVar33._12_4_ = auVar8._12_4_ + 0x800 >> 0xc;
  auVar326 = packssdw(auVar65,auVar33);
  auVar8 = paddsw(auVar118,auVar98);
  auVar201 = psubsw(auVar118,auVar98);
  auVar214 = paddsw(auVar334,auVar308);
  auVar170 = psubsw(auVar334,auVar308);
  local_b8 = auVar306._0_2_;
  uStack_b6 = auVar306._2_2_;
  uStack_b4 = auVar306._4_2_;
  uStack_b2 = auVar306._6_2_;
  uStack_b0 = auVar306._8_2_;
  uStack_ae = auVar306._10_2_;
  uStack_ac = auVar306._12_2_;
  uStack_aa = auVar306._14_2_;
  auVar298._0_12_ = auVar50._0_12_;
  auVar298._12_2_ = auVar50._6_2_;
  auVar298._14_2_ = uStack_b2;
  auVar297._12_4_ = auVar298._12_4_;
  auVar297._0_10_ = auVar50._0_10_;
  auVar297._10_2_ = uStack_b4;
  auVar296._10_6_ = auVar297._10_6_;
  auVar296._0_8_ = auVar50._0_8_;
  auVar296._8_2_ = auVar50._4_2_;
  auVar295._8_8_ = auVar296._8_8_;
  auVar295._6_2_ = uStack_b6;
  auVar295._4_2_ = auVar50._2_2_;
  auVar295._0_2_ = auVar50._0_2_;
  auVar295._2_2_ = local_b8;
  auVar308._2_2_ = uStack_b0;
  auVar308._0_2_ = auVar50._8_2_;
  auVar308._4_2_ = auVar50._10_2_;
  auVar308._6_2_ = uStack_ae;
  auVar308._8_2_ = auVar50._12_2_;
  auVar308._10_2_ = uStack_ac;
  auVar308._12_2_ = auVar50._14_2_;
  auVar308._14_2_ = uStack_aa;
  auVar101._8_4_ = 0x61ff138;
  auVar101._0_8_ = 0x61ff138061ff138;
  auVar101._12_4_ = 0x61ff138;
  auVar306 = pmaddwd(auVar295,auVar101);
  auVar50 = pmaddwd(auVar308,auVar101);
  auVar34._0_4_ = auVar306._0_4_ + 0x800 >> 0xc;
  auVar34._4_4_ = auVar306._4_4_ + 0x800 >> 0xc;
  auVar34._8_4_ = auVar306._8_4_ + 0x800 >> 0xc;
  auVar34._12_4_ = auVar306._12_4_ + 0x800 >> 0xc;
  auVar234._0_4_ = auVar50._0_4_ + 0x800 >> 0xc;
  auVar234._4_4_ = auVar50._4_4_ + 0x800 >> 0xc;
  auVar234._8_4_ = auVar50._8_4_ + 0x800 >> 0xc;
  auVar234._12_4_ = auVar50._12_4_ + 0x800 >> 0xc;
  auVar118 = packssdw(auVar34,auVar234);
  auVar315._8_4_ = 0xec8061f;
  auVar315._0_8_ = 0xec8061f0ec8061f;
  auVar315._12_4_ = 0xec8061f;
  auVar50 = pmaddwd(auVar295,auVar315);
  auVar306 = pmaddwd(auVar308,auVar315);
  auVar299._0_4_ = auVar50._0_4_ + 0x800 >> 0xc;
  auVar299._4_4_ = auVar50._4_4_ + 0x800 >> 0xc;
  auVar299._8_4_ = auVar50._8_4_ + 0x800 >> 0xc;
  auVar299._12_4_ = auVar50._12_4_ + 0x800 >> 0xc;
  auVar204._0_4_ = auVar306._0_4_ + 0x800 >> 0xc;
  auVar204._4_4_ = auVar306._4_4_ + 0x800 >> 0xc;
  auVar204._8_4_ = auVar306._8_4_ + 0x800 >> 0xc;
  auVar204._12_4_ = auVar306._12_4_ + 0x800 >> 0xc;
  auVar289 = packssdw(auVar299,auVar204);
  local_218 = auVar284._0_2_;
  uStack_216 = auVar284._2_2_;
  uStack_214 = auVar284._4_2_;
  uStack_212 = auVar284._6_2_;
  uStack_210 = auVar284._8_2_;
  uStack_20e = auVar284._10_2_;
  uStack_20c = auVar284._12_2_;
  uStack_20a = auVar284._14_2_;
  auVar259._0_12_ = auVar255._0_12_;
  auVar259._12_2_ = auVar255._6_2_;
  auVar259._14_2_ = uStack_212;
  auVar258._12_4_ = auVar259._12_4_;
  auVar258._0_10_ = auVar255._0_10_;
  auVar258._10_2_ = uStack_214;
  auVar257._10_6_ = auVar258._10_6_;
  auVar257._0_8_ = auVar255._0_8_;
  auVar257._8_2_ = auVar255._4_2_;
  auVar256._8_8_ = auVar257._8_8_;
  auVar256._6_2_ = uStack_216;
  auVar256._4_2_ = auVar255._2_2_;
  auVar256._0_2_ = auVar255._0_2_;
  auVar256._2_2_ = local_218;
  auVar102._2_2_ = uStack_210;
  auVar102._0_2_ = auVar255._8_2_;
  auVar102._4_2_ = auVar255._10_2_;
  auVar102._6_2_ = uStack_20e;
  auVar102._8_2_ = auVar255._12_2_;
  auVar102._10_2_ = uStack_20c;
  auVar102._12_2_ = auVar255._14_2_;
  auVar102._14_2_ = uStack_20a;
  auVar205._8_4_ = 0xf138f9e1;
  auVar205._0_8_ = 0xf138f9e1f138f9e1;
  auVar205._12_4_ = 0xf138f9e1;
  auVar284 = pmaddwd(auVar256,auVar205);
  auVar306 = pmaddwd(auVar102,auVar205);
  auVar235._0_4_ = auVar284._0_4_ + 0x800 >> 0xc;
  auVar235._4_4_ = auVar284._4_4_ + 0x800 >> 0xc;
  auVar235._8_4_ = auVar284._8_4_ + 0x800 >> 0xc;
  auVar235._12_4_ = auVar284._12_4_ + 0x800 >> 0xc;
  auVar281._0_4_ = auVar306._0_4_ + 0x800 >> 0xc;
  auVar281._4_4_ = auVar306._4_4_ + 0x800 >> 0xc;
  auVar281._8_4_ = auVar306._8_4_ + 0x800 >> 0xc;
  auVar281._12_4_ = auVar306._12_4_ + 0x800 >> 0xc;
  auVar172 = packssdw(auVar235,auVar281);
  auVar306 = pmaddwd(auVar256,auVar101);
  auVar284 = pmaddwd(auVar102,auVar101);
  auVar260._0_4_ = auVar306._0_4_ + 0x800 >> 0xc;
  auVar260._4_4_ = auVar306._4_4_ + 0x800 >> 0xc;
  auVar260._8_4_ = auVar306._8_4_ + 0x800 >> 0xc;
  auVar260._12_4_ = auVar306._12_4_ + 0x800 >> 0xc;
  auVar103._0_4_ = auVar284._0_4_ + 0x800 >> 0xc;
  auVar103._4_4_ = auVar284._4_4_ + 0x800 >> 0xc;
  auVar103._8_4_ = auVar284._8_4_ + 0x800 >> 0xc;
  auVar103._12_4_ = auVar284._12_4_ + 0x800 >> 0xc;
  auVar266 = packssdw(auVar260,auVar103);
  auVar284 = paddsw(auVar93,auVar14);
  auVar98 = psubsw(auVar93,auVar14);
  auVar306 = paddsw(auVar317,auVar264);
  auVar308 = psubsw(auVar317,auVar264);
  auVar272 = psubsw(auVar200,auVar94);
  auVar264 = paddsw(auVar200,auVar94);
  auVar120 = psubsw(auVar144,auVar337);
  auVar191 = paddsw(auVar144,auVar337);
  auVar144 = paddsw(auVar328,auVar119);
  auVar328 = psubsw(auVar328,auVar119);
  auVar14 = paddsw(auVar287,auVar273);
  auVar119 = psubsw(auVar287,auVar273);
  auVar273 = psubsw(auVar95,auVar251);
  auVar287 = paddsw(auVar95,auVar251);
  auVar251 = psubsw(auVar224,auVar153);
  auVar153 = paddsw(auVar153,auVar224);
  auVar95 = paddsw(auVar293,auVar326);
  auVar326 = psubsw(auVar293,auVar326);
  auVar93 = paddsw(auVar286,auVar112);
  auVar50 = psubsw(auVar286,auVar112);
  local_1e8 = auVar170._0_2_;
  uStack_1e6 = auVar170._2_2_;
  uStack_1e4 = auVar170._4_2_;
  uStack_1e2 = auVar170._6_2_;
  uStack_1e0 = auVar170._8_2_;
  uStack_1de = auVar170._10_2_;
  uStack_1dc = auVar170._12_2_;
  uStack_1da = auVar170._14_2_;
  auVar341._0_12_ = auVar201._0_12_;
  auVar341._12_2_ = auVar201._6_2_;
  auVar341._14_2_ = uStack_1e2;
  auVar340._12_4_ = auVar341._12_4_;
  auVar340._0_10_ = auVar201._0_10_;
  auVar340._10_2_ = uStack_1e4;
  auVar339._10_6_ = auVar340._10_6_;
  auVar339._0_8_ = auVar201._0_8_;
  auVar339._8_2_ = auVar201._4_2_;
  auVar338._8_8_ = auVar339._8_8_;
  auVar338._6_2_ = uStack_1e6;
  auVar338._4_2_ = auVar201._2_2_;
  auVar338._0_2_ = auVar201._0_2_;
  auVar338._2_2_ = local_1e8;
  auVar173._2_2_ = uStack_1e0;
  auVar173._0_2_ = auVar201._8_2_;
  auVar173._4_2_ = auVar201._10_2_;
  auVar173._6_2_ = uStack_1de;
  auVar173._8_2_ = auVar201._12_2_;
  auVar173._10_2_ = uStack_1dc;
  auVar173._12_2_ = auVar201._14_2_;
  auVar173._14_2_ = uStack_1da;
  auVar159._8_4_ = 0xb50f4b0;
  auVar159._0_8_ = 0xb50f4b00b50f4b0;
  auVar159._12_4_ = 0xb50f4b0;
  auVar170 = pmaddwd(auVar338,auVar159);
  auVar94 = pmaddwd(auVar173,auVar159);
  auVar255._0_4_ = auVar170._0_4_ + 0x800 >> 0xc;
  auVar255._4_4_ = auVar170._4_4_ + 0x800 >> 0xc;
  auVar255._8_4_ = auVar170._8_4_ + 0x800 >> 0xc;
  auVar255._12_4_ = auVar170._12_4_ + 0x800 >> 0xc;
  auVar66._0_4_ = auVar94._0_4_ + 0x800 >> 0xc;
  auVar66._4_4_ = auVar94._4_4_ + 0x800 >> 0xc;
  auVar66._8_4_ = auVar94._8_4_ + 0x800 >> 0xc;
  auVar66._12_4_ = auVar94._12_4_ + 0x800 >> 0xc;
  auVar170 = packssdw(auVar255,auVar66);
  auVar200 = pmaddwd(auVar338,auVar31);
  auVar94 = pmaddwd(auVar173,auVar31);
  auVar342._0_4_ = auVar200._0_4_ + 0x800 >> 0xc;
  auVar342._4_4_ = auVar200._4_4_ + 0x800 >> 0xc;
  auVar342._8_4_ = auVar200._8_4_ + 0x800 >> 0xc;
  auVar342._12_4_ = auVar200._12_4_ + 0x800 >> 0xc;
  auVar174._0_4_ = auVar94._0_4_ + 0x800 >> 0xc;
  auVar174._4_4_ = auVar94._4_4_ + 0x800 >> 0xc;
  auVar174._8_4_ = auVar94._8_4_ + 0x800 >> 0xc;
  auVar174._12_4_ = auVar94._12_4_ + 0x800 >> 0xc;
  auVar286 = packssdw(auVar342,auVar174);
  auVar112 = paddsw(auVar99,auVar313);
  auVar94 = psubsw(auVar99,auVar313);
  auVar200 = paddsw(auVar118,auVar172);
  auVar313 = psubsw(auVar118,auVar172);
  auVar172 = psubsw(auVar92,auVar147);
  auVar92 = paddsw(auVar92,auVar147);
  auVar224 = psubsw(auVar289,auVar266);
  auVar118 = paddsw(auVar266,auVar289);
  auVar163._0_12_ = auVar308._0_12_;
  auVar163._12_2_ = auVar308._6_2_;
  auVar163._14_2_ = auVar251._6_2_;
  auVar162._12_4_ = auVar163._12_4_;
  auVar162._0_10_ = auVar308._0_10_;
  auVar162._10_2_ = auVar251._4_2_;
  auVar161._10_6_ = auVar162._10_6_;
  auVar161._0_8_ = auVar308._0_8_;
  auVar161._8_2_ = auVar308._4_2_;
  auVar160._8_8_ = auVar161._8_8_;
  auVar160._6_2_ = auVar251._2_2_;
  auVar160._4_2_ = auVar308._2_2_;
  auVar160._0_2_ = auVar308._0_2_;
  auVar160._2_2_ = auVar251._0_2_;
  auVar318._2_2_ = auVar251._8_2_;
  auVar318._0_2_ = auVar308._8_2_;
  auVar318._4_2_ = auVar308._10_2_;
  auVar318._6_2_ = auVar251._10_2_;
  auVar318._8_2_ = auVar308._12_2_;
  auVar318._10_2_ = auVar251._12_2_;
  auVar318._12_2_ = auVar308._14_2_;
  auVar318._14_2_ = auVar251._14_2_;
  auVar251 = pmaddwd(auVar160,auVar101);
  auVar147 = pmaddwd(auVar318,auVar101);
  auVar133._0_4_ = auVar251._0_4_ + 0x800 >> 0xc;
  auVar133._4_4_ = auVar251._4_4_ + 0x800 >> 0xc;
  auVar133._8_4_ = auVar251._8_4_ + 0x800 >> 0xc;
  auVar133._12_4_ = auVar251._12_4_ + 0x800 >> 0xc;
  auVar67._0_4_ = auVar147._0_4_ + 0x800 >> 0xc;
  auVar67._4_4_ = auVar147._4_4_ + 0x800 >> 0xc;
  auVar67._8_4_ = auVar147._8_4_ + 0x800 >> 0xc;
  auVar67._12_4_ = auVar147._12_4_ + 0x800 >> 0xc;
  auVar99 = packssdw(auVar133,auVar67);
  auVar147 = pmaddwd(auVar160,auVar315);
  auVar251 = pmaddwd(auVar318,auVar315);
  auVar164._0_4_ = auVar147._0_4_ + 0x800 >> 0xc;
  auVar164._4_4_ = auVar147._4_4_ + 0x800 >> 0xc;
  auVar164._8_4_ = auVar147._8_4_ + 0x800 >> 0xc;
  auVar164._12_4_ = auVar147._12_4_ + 0x800 >> 0xc;
  auVar319._0_4_ = auVar251._0_4_ + 0x800 >> 0xc;
  auVar319._4_4_ = auVar251._4_4_ + 0x800 >> 0xc;
  auVar319._8_4_ = auVar251._8_4_ + 0x800 >> 0xc;
  auVar319._12_4_ = auVar251._12_4_ + 0x800 >> 0xc;
  auVar201 = packssdw(auVar164,auVar319);
  local_198 = auVar273._0_2_;
  uStack_196 = auVar273._2_2_;
  uStack_194 = auVar273._4_2_;
  uStack_192 = auVar273._6_2_;
  uStack_190 = auVar273._8_2_;
  uStack_18e = auVar273._10_2_;
  uStack_18c = auVar273._12_2_;
  uStack_18a = auVar273._14_2_;
  auVar71._0_12_ = auVar98._0_12_;
  auVar71._12_2_ = auVar98._6_2_;
  auVar71._14_2_ = uStack_192;
  auVar70._12_4_ = auVar71._12_4_;
  auVar70._0_10_ = auVar98._0_10_;
  auVar70._10_2_ = uStack_194;
  auVar69._10_6_ = auVar70._10_6_;
  auVar69._0_8_ = auVar98._0_8_;
  auVar69._8_2_ = auVar98._4_2_;
  auVar68._8_8_ = auVar69._8_8_;
  auVar68._6_2_ = uStack_196;
  auVar68._4_2_ = auVar98._2_2_;
  auVar68._0_2_ = auVar98._0_2_;
  auVar68._2_2_ = local_198;
  auVar236._2_2_ = uStack_190;
  auVar236._0_2_ = auVar98._8_2_;
  auVar236._4_2_ = auVar98._10_2_;
  auVar236._6_2_ = uStack_18e;
  auVar236._8_2_ = auVar98._12_2_;
  auVar236._10_2_ = uStack_18c;
  auVar236._12_2_ = auVar98._14_2_;
  auVar236._14_2_ = uStack_18a;
  auVar147 = pmaddwd(auVar68,auVar315);
  auVar266 = pmaddwd(auVar236,auVar315);
  auVar251 = pmaddwd(auVar68,auVar101);
  auVar98 = pmaddwd(auVar236,auVar101);
  auVar175._0_4_ = auVar251._0_4_ + 0x800 >> 0xc;
  auVar175._4_4_ = auVar251._4_4_ + 0x800 >> 0xc;
  auVar175._8_4_ = auVar251._8_4_ + 0x800 >> 0xc;
  auVar175._12_4_ = auVar251._12_4_ + 0x800 >> 0xc;
  auVar193._0_4_ = auVar98._0_4_ + 0x800 >> 0xc;
  auVar193._4_4_ = auVar98._4_4_ + 0x800 >> 0xc;
  auVar193._8_4_ = auVar98._8_4_ + 0x800 >> 0xc;
  auVar193._12_4_ = auVar98._12_4_ + 0x800 >> 0xc;
  auVar273 = packssdw(auVar175,auVar193);
  auVar72._0_4_ = auVar147._0_4_ + 0x800 >> 0xc;
  auVar72._4_4_ = auVar147._4_4_ + 0x800 >> 0xc;
  auVar72._8_4_ = auVar147._8_4_ + 0x800 >> 0xc;
  auVar72._12_4_ = auVar147._12_4_ + 0x800 >> 0xc;
  auVar237._0_4_ = auVar266._0_4_ + 0x800 >> 0xc;
  auVar237._4_4_ = auVar266._4_4_ + 0x800 >> 0xc;
  auVar237._8_4_ = auVar266._8_4_ + 0x800 >> 0xc;
  auVar237._12_4_ = auVar266._12_4_ + 0x800 >> 0xc;
  auVar147 = packssdw(auVar72,auVar237);
  local_1c8 = auVar328._0_2_;
  uStack_1c6 = auVar328._2_2_;
  uStack_1c4 = auVar328._4_2_;
  uStack_1c2 = auVar328._6_2_;
  uStack_1c0 = auVar328._8_2_;
  uStack_1be = auVar328._10_2_;
  uStack_1bc = auVar328._12_2_;
  uStack_1ba = auVar328._14_2_;
  auVar241._0_12_ = auVar272._0_12_;
  auVar241._12_2_ = auVar272._6_2_;
  auVar241._14_2_ = uStack_1c2;
  auVar240._12_4_ = auVar241._12_4_;
  auVar240._0_10_ = auVar272._0_10_;
  auVar240._10_2_ = uStack_1c4;
  auVar239._10_6_ = auVar240._10_6_;
  auVar239._0_8_ = auVar272._0_8_;
  auVar239._8_2_ = auVar272._4_2_;
  auVar238._8_8_ = auVar239._8_8_;
  auVar238._6_2_ = uStack_1c6;
  auVar238._4_2_ = auVar272._2_2_;
  auVar238._0_2_ = auVar272._0_2_;
  auVar238._2_2_ = local_1c8;
  auVar261._2_2_ = uStack_1c0;
  auVar261._0_2_ = auVar272._8_2_;
  auVar261._4_2_ = auVar272._10_2_;
  auVar261._6_2_ = uStack_1be;
  auVar261._8_2_ = auVar272._12_2_;
  auVar261._10_2_ = uStack_1bc;
  auVar261._12_2_ = auVar272._14_2_;
  auVar261._14_2_ = uStack_1ba;
  auVar251 = pmaddwd(auVar238,auVar205);
  auVar328 = pmaddwd(auVar261,auVar205);
  auVar300._0_4_ = auVar251._0_4_ + 0x800 >> 0xc;
  auVar300._4_4_ = auVar251._4_4_ + 0x800 >> 0xc;
  auVar300._8_4_ = auVar251._8_4_ + 0x800 >> 0xc;
  auVar300._12_4_ = auVar251._12_4_ + 0x800 >> 0xc;
  auVar194._0_4_ = auVar328._0_4_ + 0x800 >> 0xc;
  auVar194._4_4_ = auVar328._4_4_ + 0x800 >> 0xc;
  auVar194._8_4_ = auVar328._8_4_ + 0x800 >> 0xc;
  auVar194._12_4_ = auVar328._12_4_ + 0x800 >> 0xc;
  auVar255 = packssdw(auVar300,auVar194);
  auVar328 = pmaddwd(auVar238,auVar101);
  auVar251 = pmaddwd(auVar261,auVar101);
  auVar242._0_4_ = auVar328._0_4_ + 0x800 >> 0xc;
  auVar242._4_4_ = auVar328._4_4_ + 0x800 >> 0xc;
  auVar242._8_4_ = auVar328._8_4_ + 0x800 >> 0xc;
  auVar242._12_4_ = auVar328._12_4_ + 0x800 >> 0xc;
  auVar262._0_4_ = auVar251._0_4_ + 0x800 >> 0xc;
  auVar262._4_4_ = auVar251._4_4_ + 0x800 >> 0xc;
  auVar262._8_4_ = auVar251._8_4_ + 0x800 >> 0xc;
  auVar262._12_4_ = auVar251._12_4_ + 0x800 >> 0xc;
  auVar289 = packssdw(auVar242,auVar262);
  local_188 = auVar119._0_2_;
  uStack_186 = auVar119._2_2_;
  uStack_184 = auVar119._4_2_;
  uStack_182 = auVar119._6_2_;
  uStack_180 = auVar119._8_2_;
  uStack_17e = auVar119._10_2_;
  uStack_17c = auVar119._12_2_;
  uStack_17a = auVar119._14_2_;
  auVar324._0_12_ = auVar120._0_12_;
  auVar324._12_2_ = auVar120._6_2_;
  auVar324._14_2_ = uStack_182;
  auVar323._12_4_ = auVar324._12_4_;
  auVar323._0_10_ = auVar120._0_10_;
  auVar323._10_2_ = uStack_184;
  auVar322._10_6_ = auVar323._10_6_;
  auVar322._0_8_ = auVar120._0_8_;
  auVar322._8_2_ = auVar120._4_2_;
  auVar321._8_8_ = auVar322._8_8_;
  auVar321._6_2_ = uStack_186;
  auVar321._4_2_ = auVar120._2_2_;
  auVar321._0_2_ = auVar120._0_2_;
  auVar321._2_2_ = local_188;
  auVar104._2_2_ = uStack_180;
  auVar104._0_2_ = auVar120._8_2_;
  auVar104._4_2_ = auVar120._10_2_;
  auVar104._6_2_ = uStack_17e;
  auVar104._8_2_ = auVar120._12_2_;
  auVar104._10_2_ = uStack_17c;
  auVar104._12_2_ = auVar120._14_2_;
  auVar104._14_2_ = uStack_17a;
  auVar98 = pmaddwd(auVar321,auVar205);
  auVar251 = pmaddwd(auVar205,auVar104);
  auVar120 = pmaddwd(auVar321,auVar101);
  auVar328 = pmaddwd(auVar104,auVar101);
  auVar263._0_4_ = auVar98._0_4_ + 0x800 >> 0xc;
  auVar263._4_4_ = auVar98._4_4_ + 0x800 >> 0xc;
  auVar263._8_4_ = auVar98._8_4_ + 0x800 >> 0xc;
  auVar263._12_4_ = auVar98._12_4_ + 0x800 >> 0xc;
  auVar206._0_4_ = auVar251._0_4_ + 0x800 >> 0xc;
  auVar206._4_4_ = auVar251._4_4_ + 0x800 >> 0xc;
  auVar206._8_4_ = auVar251._8_4_ + 0x800 >> 0xc;
  auVar206._12_4_ = auVar251._12_4_ + 0x800 >> 0xc;
  auVar98 = packssdw(auVar263,auVar206);
  auVar325._0_4_ = auVar120._0_4_ + 0x800 >> 0xc;
  auVar325._4_4_ = auVar120._4_4_ + 0x800 >> 0xc;
  auVar325._8_4_ = auVar120._8_4_ + 0x800 >> 0xc;
  auVar325._12_4_ = auVar120._12_4_ + 0x800 >> 0xc;
  auVar105._0_4_ = auVar328._0_4_ + 0x800 >> 0xc;
  auVar105._4_4_ = auVar328._4_4_ + 0x800 >> 0xc;
  auVar105._8_4_ = auVar328._8_4_ + 0x800 >> 0xc;
  auVar105._12_4_ = auVar328._12_4_ + 0x800 >> 0xc;
  auVar334 = packssdw(auVar325,auVar105);
  auVar308 = paddsw(auVar95,auVar214);
  auVar328 = psubsw(auVar95,auVar214);
  auVar266 = paddsw(auVar93,auVar286);
  auVar93 = psubsw(auVar93,auVar286);
  auVar272 = paddsw(auVar50,auVar170);
  auVar251 = psubsw(auVar50,auVar170);
  auVar170 = paddsw(auVar326,auVar8);
  auVar8 = psubsw(auVar326,auVar8);
  local_108 = auVar224._0_2_;
  uStack_106 = auVar224._2_2_;
  uStack_104 = auVar224._4_2_;
  uStack_102 = auVar224._6_2_;
  uStack_100 = auVar224._8_2_;
  uStack_fe = auVar224._10_2_;
  uStack_fc = auVar224._12_2_;
  uStack_fa = auVar224._14_2_;
  auVar346._0_12_ = auVar313._0_12_;
  auVar346._12_2_ = auVar313._6_2_;
  auVar346._14_2_ = uStack_102;
  auVar345._12_4_ = auVar346._12_4_;
  auVar345._0_10_ = auVar313._0_10_;
  auVar345._10_2_ = uStack_104;
  auVar344._10_6_ = auVar345._10_6_;
  auVar344._0_8_ = auVar313._0_8_;
  auVar344._8_2_ = auVar313._4_2_;
  auVar343._8_8_ = auVar344._8_8_;
  auVar343._6_2_ = uStack_106;
  auVar343._4_2_ = auVar313._2_2_;
  auVar343._0_2_ = auVar313._0_2_;
  auVar343._2_2_ = local_108;
  auVar35._2_2_ = uStack_100;
  auVar35._0_2_ = auVar313._8_2_;
  auVar35._4_2_ = auVar313._10_2_;
  auVar35._6_2_ = uStack_fe;
  auVar35._8_2_ = auVar313._12_2_;
  auVar35._10_2_ = uStack_fc;
  auVar35._12_2_ = auVar313._14_2_;
  auVar35._14_2_ = uStack_fa;
  auVar326 = pmaddwd(auVar343,auVar159);
  auVar214 = pmaddwd(auVar35,auVar159);
  auVar320._0_4_ = auVar326._0_4_ + 0x800 >> 0xc;
  auVar320._4_4_ = auVar326._4_4_ + 0x800 >> 0xc;
  auVar320._8_4_ = auVar326._8_4_ + 0x800 >> 0xc;
  auVar320._12_4_ = auVar326._12_4_ + 0x800 >> 0xc;
  auVar293._0_4_ = auVar214._0_4_ + 0x800 >> 0xc;
  auVar293._4_4_ = auVar214._4_4_ + 0x800 >> 0xc;
  auVar293._8_4_ = auVar214._8_4_ + 0x800 >> 0xc;
  auVar293._12_4_ = auVar214._12_4_ + 0x800 >> 0xc;
  auVar313 = packssdw(auVar320,auVar293);
  auVar326 = pmaddwd(auVar343,auVar31);
  auVar214 = pmaddwd(auVar35,auVar31);
  auVar347._0_4_ = auVar326._0_4_ + 0x800 >> 0xc;
  auVar347._4_4_ = auVar326._4_4_ + 0x800 >> 0xc;
  auVar347._8_4_ = auVar326._8_4_ + 0x800 >> 0xc;
  auVar347._12_4_ = auVar326._12_4_ + 0x800 >> 0xc;
  auVar36._0_4_ = auVar214._0_4_ + 0x800 >> 0xc;
  auVar36._4_4_ = auVar214._4_4_ + 0x800 >> 0xc;
  auVar36._8_4_ = auVar214._8_4_ + 0x800 >> 0xc;
  auVar36._12_4_ = auVar214._12_4_ + 0x800 >> 0xc;
  auVar337 = packssdw(auVar347,auVar36);
  local_48 = auVar172._0_2_;
  uStack_46 = auVar172._2_2_;
  uStack_44 = auVar172._4_2_;
  uStack_42 = auVar172._6_2_;
  uStack_40 = auVar172._8_2_;
  uStack_3e = auVar172._10_2_;
  uStack_3c = auVar172._12_2_;
  uStack_3a = auVar172._14_2_;
  auVar40._0_12_ = auVar94._0_12_;
  auVar40._12_2_ = auVar94._6_2_;
  auVar40._14_2_ = uStack_42;
  auVar39._12_4_ = auVar40._12_4_;
  auVar39._0_10_ = auVar94._0_10_;
  auVar39._10_2_ = uStack_44;
  auVar38._10_6_ = auVar39._10_6_;
  auVar38._0_8_ = auVar94._0_8_;
  auVar38._8_2_ = auVar94._4_2_;
  auVar37._8_8_ = auVar38._8_8_;
  auVar37._6_2_ = uStack_46;
  auVar37._4_2_ = auVar94._2_2_;
  auVar37._0_2_ = auVar94._0_2_;
  auVar37._2_2_ = local_48;
  auVar207._2_2_ = uStack_40;
  auVar207._0_2_ = auVar94._8_2_;
  auVar207._4_2_ = auVar94._10_2_;
  auVar207._6_2_ = uStack_3e;
  auVar207._8_2_ = auVar94._12_2_;
  auVar207._10_2_ = uStack_3c;
  auVar207._12_2_ = auVar94._14_2_;
  auVar207._14_2_ = uStack_3a;
  auVar214 = pmaddwd(auVar37,auVar159);
  auVar326 = pmaddwd(auVar207,auVar159);
  auVar317._0_4_ = auVar214._0_4_ + 0x800 >> 0xc;
  auVar317._4_4_ = auVar214._4_4_ + 0x800 >> 0xc;
  auVar317._8_4_ = auVar214._8_4_ + 0x800 >> 0xc;
  auVar317._12_4_ = auVar214._12_4_ + 0x800 >> 0xc;
  auVar106._0_4_ = auVar326._0_4_ + 0x800 >> 0xc;
  auVar106._4_4_ = auVar326._4_4_ + 0x800 >> 0xc;
  auVar106._8_4_ = auVar326._8_4_ + 0x800 >> 0xc;
  auVar106._12_4_ = auVar326._12_4_ + 0x800 >> 0xc;
  auVar214 = packssdw(auVar317,auVar106);
  auVar326 = pmaddwd(auVar37,auVar31);
  auVar50 = pmaddwd(auVar207,auVar31);
  auVar41._0_4_ = auVar326._0_4_ + 0x800 >> 0xc;
  auVar41._4_4_ = auVar326._4_4_ + 0x800 >> 0xc;
  auVar41._8_4_ = auVar326._8_4_ + 0x800 >> 0xc;
  auVar41._12_4_ = auVar326._12_4_ + 0x800 >> 0xc;
  auVar107._0_4_ = auVar50._0_4_ + 0x800 >> 0xc;
  auVar107._4_4_ = auVar50._4_4_ + 0x800 >> 0xc;
  auVar107._8_4_ = auVar50._8_4_ + 0x800 >> 0xc;
  auVar107._12_4_ = auVar50._12_4_ + 0x800 >> 0xc;
  auVar326 = packssdw(auVar41,auVar107);
  auVar286 = paddsw(auVar284,auVar264);
  auVar172 = psubsw(auVar284,auVar264);
  auVar315 = paddsw(auVar306,auVar191);
  auVar94 = psubsw(auVar306,auVar191);
  auVar95 = paddsw(auVar99,auVar98);
  auVar224 = psubsw(auVar99,auVar98);
  auVar98 = paddsw(auVar273,auVar255);
  auVar191 = psubsw(auVar273,auVar255);
  auVar255 = psubsw(auVar287,auVar144);
  auVar99 = paddsw(auVar287,auVar144);
  auVar273 = psubsw(auVar153,auVar14);
  auVar120 = paddsw(auVar153,auVar14);
  auVar119 = psubsw(auVar201,auVar334);
  auVar293 = paddsw(auVar334,auVar201);
  auVar306 = psubsw(auVar147,auVar289);
  auVar153 = paddsw(auVar289,auVar147);
  auVar289 = paddsw(auVar308,auVar92);
  auVar14 = psubsw(auVar308,auVar92);
  auVar308 = paddsw(auVar266,auVar118);
  auVar287 = psubsw(auVar266,auVar118);
  auVar201 = paddsw(auVar272,auVar337);
  auVar50 = psubsw(auVar272,auVar337);
  auVar272 = paddsw(auVar170,auVar326);
  auVar326 = psubsw(auVar170,auVar326);
  auVar170 = paddsw(auVar8,auVar214);
  auVar264 = psubsw(auVar8,auVar214);
  auVar144 = paddsw(auVar251,auVar313);
  auVar8 = psubsw(auVar251,auVar313);
  auVar266 = paddsw(auVar93,auVar200);
  auVar214 = psubsw(auVar93,auVar200);
  auVar313 = paddsw(auVar328,auVar112);
  auVar284 = psubsw(auVar328,auVar112);
  auVar76._0_12_ = auVar191._0_12_;
  auVar76._12_2_ = auVar191._6_2_;
  auVar76._14_2_ = auVar306._6_2_;
  auVar75._12_4_ = auVar76._12_4_;
  auVar75._0_10_ = auVar191._0_10_;
  auVar75._10_2_ = auVar306._4_2_;
  auVar74._10_6_ = auVar75._10_6_;
  auVar74._0_8_ = auVar191._0_8_;
  auVar74._8_2_ = auVar191._4_2_;
  auVar73._8_8_ = auVar74._8_8_;
  auVar73._6_2_ = auVar306._2_2_;
  auVar73._4_2_ = auVar191._2_2_;
  auVar73._0_2_ = auVar191._0_2_;
  auVar73._2_2_ = auVar306._0_2_;
  auVar176._2_2_ = auVar306._8_2_;
  auVar176._0_2_ = auVar191._8_2_;
  auVar176._4_2_ = auVar191._10_2_;
  auVar176._6_2_ = auVar306._10_2_;
  auVar176._8_2_ = auVar191._12_2_;
  auVar176._10_2_ = auVar306._12_2_;
  auVar176._12_2_ = auVar191._14_2_;
  auVar176._14_2_ = auVar306._14_2_;
  auVar92 = pmaddwd(auVar73,auVar159);
  auVar306 = pmaddwd(auVar176,auVar159);
  auVar301._0_4_ = auVar92._0_4_ + 0x800 >> 0xc;
  auVar301._4_4_ = auVar92._4_4_ + 0x800 >> 0xc;
  auVar301._8_4_ = auVar92._8_4_ + 0x800 >> 0xc;
  auVar301._12_4_ = auVar92._12_4_ + 0x800 >> 0xc;
  auVar334._0_4_ = auVar306._0_4_ + 0x800 >> 0xc;
  auVar334._4_4_ = auVar306._4_4_ + 0x800 >> 0xc;
  auVar334._8_4_ = auVar306._8_4_ + 0x800 >> 0xc;
  auVar334._12_4_ = auVar306._12_4_ + 0x800 >> 0xc;
  auVar191 = packssdw(auVar301,auVar334);
  auVar306 = pmaddwd(auVar73,auVar31);
  auVar92 = pmaddwd(auVar176,auVar31);
  auVar77._0_4_ = auVar306._0_4_ + 0x800 >> 0xc;
  auVar77._4_4_ = auVar306._4_4_ + 0x800 >> 0xc;
  auVar77._8_4_ = auVar306._8_4_ + 0x800 >> 0xc;
  auVar77._12_4_ = auVar306._12_4_ + 0x800 >> 0xc;
  auVar177._0_4_ = auVar92._0_4_ + 0x800 >> 0xc;
  auVar177._4_4_ = auVar92._4_4_ + 0x800 >> 0xc;
  auVar177._8_4_ = auVar92._8_4_ + 0x800 >> 0xc;
  auVar177._12_4_ = auVar92._12_4_ + 0x800 >> 0xc;
  auVar92 = packssdw(auVar77,auVar177);
  auVar181._0_12_ = auVar224._0_12_;
  auVar181._12_2_ = auVar224._6_2_;
  auVar181._14_2_ = auVar119._6_2_;
  auVar180._12_4_ = auVar181._12_4_;
  auVar180._0_10_ = auVar224._0_10_;
  auVar180._10_2_ = auVar119._4_2_;
  auVar179._10_6_ = auVar180._10_6_;
  auVar179._0_8_ = auVar224._0_8_;
  auVar179._8_2_ = auVar224._4_2_;
  auVar178._8_8_ = auVar179._8_8_;
  auVar178._6_2_ = auVar119._2_2_;
  auVar178._4_2_ = auVar224._2_2_;
  auVar178._0_2_ = auVar224._0_2_;
  auVar178._2_2_ = auVar119._0_2_;
  auVar134._2_2_ = auVar119._8_2_;
  auVar134._0_2_ = auVar224._8_2_;
  auVar134._4_2_ = auVar224._10_2_;
  auVar134._6_2_ = auVar119._10_2_;
  auVar134._8_2_ = auVar224._12_2_;
  auVar134._10_2_ = auVar119._12_2_;
  auVar134._12_2_ = auVar224._14_2_;
  auVar134._14_2_ = auVar119._14_2_;
  auVar118 = pmaddwd(auVar178,auVar159);
  auVar306 = pmaddwd(auVar134,auVar159);
  auVar243._0_4_ = auVar118._0_4_ + 0x800 >> 0xc;
  auVar243._4_4_ = auVar118._4_4_ + 0x800 >> 0xc;
  auVar243._8_4_ = auVar118._8_4_ + 0x800 >> 0xc;
  auVar243._12_4_ = auVar118._12_4_ + 0x800 >> 0xc;
  auVar337._0_4_ = auVar306._0_4_ + 0x800 >> 0xc;
  auVar337._4_4_ = auVar306._4_4_ + 0x800 >> 0xc;
  auVar337._8_4_ = auVar306._8_4_ + 0x800 >> 0xc;
  auVar337._12_4_ = auVar306._12_4_ + 0x800 >> 0xc;
  auVar328 = packssdw(auVar243,auVar337);
  auVar118 = pmaddwd(auVar178,auVar31);
  auVar306 = pmaddwd(auVar134,auVar31);
  auVar182._0_4_ = auVar118._0_4_ + 0x800 >> 0xc;
  auVar182._4_4_ = auVar118._4_4_ + 0x800 >> 0xc;
  auVar182._8_4_ = auVar118._8_4_ + 0x800 >> 0xc;
  auVar182._12_4_ = auVar118._12_4_ + 0x800 >> 0xc;
  auVar135._0_4_ = auVar306._0_4_ + 0x800 >> 0xc;
  auVar135._4_4_ = auVar306._4_4_ + 0x800 >> 0xc;
  auVar135._8_4_ = auVar306._8_4_ + 0x800 >> 0xc;
  auVar135._12_4_ = auVar306._12_4_ + 0x800 >> 0xc;
  auVar93 = packssdw(auVar182,auVar135);
  auVar139._0_12_ = auVar94._0_12_;
  auVar139._12_2_ = auVar94._6_2_;
  auVar139._14_2_ = auVar273._6_2_;
  auVar138._12_4_ = auVar139._12_4_;
  auVar138._0_10_ = auVar94._0_10_;
  auVar138._10_2_ = auVar273._4_2_;
  auVar137._10_6_ = auVar138._10_6_;
  auVar137._0_8_ = auVar94._0_8_;
  auVar137._8_2_ = auVar94._4_2_;
  auVar136._8_8_ = auVar137._8_8_;
  auVar136._6_2_ = auVar273._2_2_;
  auVar136._4_2_ = auVar94._2_2_;
  auVar136._0_2_ = auVar94._0_2_;
  auVar136._2_2_ = auVar273._0_2_;
  auVar9._2_2_ = auVar273._8_2_;
  auVar9._0_2_ = auVar94._8_2_;
  auVar9._4_2_ = auVar94._10_2_;
  auVar9._6_2_ = auVar273._10_2_;
  auVar9._8_2_ = auVar94._12_2_;
  auVar9._10_2_ = auVar273._12_2_;
  auVar9._12_2_ = auVar94._14_2_;
  auVar9._14_2_ = auVar273._14_2_;
  auVar118 = pmaddwd(auVar136,auVar159);
  auVar306 = pmaddwd(auVar9,auVar159);
  auVar108._0_4_ = auVar118._0_4_ + 0x800 >> 0xc;
  auVar108._4_4_ = auVar118._4_4_ + 0x800 >> 0xc;
  auVar108._8_4_ = auVar118._8_4_ + 0x800 >> 0xc;
  auVar108._12_4_ = auVar118._12_4_ + 0x800 >> 0xc;
  auVar10._0_4_ = auVar306._0_4_ + 0x800 >> 0xc;
  auVar10._4_4_ = auVar306._4_4_ + 0x800 >> 0xc;
  auVar10._8_4_ = auVar306._8_4_ + 0x800 >> 0xc;
  auVar10._12_4_ = auVar306._12_4_ + 0x800 >> 0xc;
  auVar118 = packssdw(auVar108,auVar10);
  auVar147 = pmaddwd(auVar136,auVar31);
  auVar306 = pmaddwd(auVar9,auVar31);
  auVar140._0_4_ = auVar147._0_4_ + 0x800 >> 0xc;
  auVar140._4_4_ = auVar147._4_4_ + 0x800 >> 0xc;
  auVar140._8_4_ = auVar147._8_4_ + 0x800 >> 0xc;
  auVar140._12_4_ = auVar147._12_4_ + 0x800 >> 0xc;
  auVar11._0_4_ = auVar306._0_4_ + 0x800 >> 0xc;
  auVar11._4_4_ = auVar306._4_4_ + 0x800 >> 0xc;
  auVar11._8_4_ = auVar306._8_4_ + 0x800 >> 0xc;
  auVar11._12_4_ = auVar306._12_4_ + 0x800 >> 0xc;
  auVar147 = packssdw(auVar140,auVar11);
  local_c8 = auVar255._0_2_;
  uStack_c6 = auVar255._2_2_;
  uStack_c4 = auVar255._4_2_;
  uStack_c2 = auVar255._6_2_;
  uStack_c0 = auVar255._8_2_;
  uStack_be = auVar255._10_2_;
  uStack_bc = auVar255._12_2_;
  uStack_ba = auVar255._14_2_;
  auVar211._0_12_ = auVar172._0_12_;
  auVar211._12_2_ = auVar172._6_2_;
  auVar211._14_2_ = uStack_c2;
  auVar210._12_4_ = auVar211._12_4_;
  auVar210._0_10_ = auVar172._0_10_;
  auVar210._10_2_ = uStack_c4;
  auVar209._10_6_ = auVar210._10_6_;
  auVar209._0_8_ = auVar172._0_8_;
  auVar209._8_2_ = auVar172._4_2_;
  auVar208._8_8_ = auVar209._8_8_;
  auVar208._6_2_ = uStack_c6;
  auVar208._4_2_ = auVar172._2_2_;
  auVar208._0_2_ = auVar172._0_2_;
  auVar208._2_2_ = local_c8;
  auVar195._2_2_ = uStack_c0;
  auVar195._0_2_ = auVar172._8_2_;
  auVar195._4_2_ = auVar172._10_2_;
  auVar195._6_2_ = uStack_be;
  auVar195._8_2_ = auVar172._12_2_;
  auVar195._10_2_ = uStack_bc;
  auVar195._12_2_ = auVar172._14_2_;
  auVar195._14_2_ = uStack_ba;
  auVar306 = pmaddwd(auVar208,auVar159);
  auVar251 = pmaddwd(auVar159,auVar195);
  auVar200 = pmaddwd(auVar208,auVar31);
  auVar94 = pmaddwd(auVar195,auVar31);
  auVar12._0_4_ = auVar306._0_4_ + 0x800 >> 0xc;
  auVar12._4_4_ = auVar306._4_4_ + 0x800 >> 0xc;
  auVar12._8_4_ = auVar306._8_4_ + 0x800 >> 0xc;
  auVar12._12_4_ = auVar306._12_4_ + 0x800 >> 0xc;
  auVar282._0_4_ = auVar251._0_4_ + 0x800 >> 0xc;
  auVar282._4_4_ = auVar251._4_4_ + 0x800 >> 0xc;
  auVar282._8_4_ = auVar251._8_4_ + 0x800 >> 0xc;
  auVar282._12_4_ = auVar251._12_4_ + 0x800 >> 0xc;
  auVar306 = packssdw(auVar12,auVar282);
  auVar212._0_4_ = auVar200._0_4_ + 0x800 >> 0xc;
  auVar212._4_4_ = auVar200._4_4_ + 0x800 >> 0xc;
  auVar212._8_4_ = auVar200._8_4_ + 0x800 >> 0xc;
  auVar212._12_4_ = auVar200._12_4_ + 0x800 >> 0xc;
  auVar196._0_4_ = auVar94._0_4_ + 0x800 >> 0xc;
  auVar196._4_4_ = auVar94._4_4_ + 0x800 >> 0xc;
  auVar196._8_4_ = auVar94._8_4_ + 0x800 >> 0xc;
  auVar196._12_4_ = auVar94._12_4_ + 0x800 >> 0xc;
  auVar94 = packssdw(auVar212,auVar196);
  alVar283 = (__m128i)paddsw(auVar289,auVar99);
  *output = alVar283;
  alVar283 = (__m128i)psubsw(auVar289,auVar99);
  output[0x1f] = alVar283;
  alVar283 = (__m128i)paddsw(auVar308,auVar120);
  output[1] = alVar283;
  alVar283 = (__m128i)psubsw(auVar308,auVar120);
  output[0x1e] = alVar283;
  alVar283 = (__m128i)paddsw(auVar201,auVar293);
  output[2] = alVar283;
  alVar283 = (__m128i)psubsw(auVar201,auVar293);
  output[0x1d] = alVar283;
  alVar283 = (__m128i)paddsw(auVar272,auVar153);
  output[3] = alVar283;
  alVar283 = (__m128i)psubsw(auVar272,auVar153);
  output[0x1c] = alVar283;
  alVar283 = (__m128i)paddsw(auVar170,auVar92);
  output[4] = alVar283;
  alVar283 = (__m128i)psubsw(auVar170,auVar92);
  output[0x1b] = alVar283;
  alVar283 = (__m128i)paddsw(auVar144,auVar93);
  output[5] = alVar283;
  alVar283 = (__m128i)psubsw(auVar144,auVar93);
  output[0x1a] = alVar283;
  alVar283 = (__m128i)paddsw(auVar266,auVar147);
  output[6] = alVar283;
  alVar283 = (__m128i)psubsw(auVar266,auVar147);
  output[0x19] = alVar283;
  alVar283 = (__m128i)paddsw(auVar313,auVar94);
  output[7] = alVar283;
  alVar283 = (__m128i)psubsw(auVar313,auVar94);
  output[0x18] = alVar283;
  alVar283 = (__m128i)paddsw(auVar284,auVar306);
  output[8] = alVar283;
  alVar283 = (__m128i)psubsw(auVar284,auVar306);
  output[0x17] = alVar283;
  alVar283 = (__m128i)paddsw(auVar214,auVar118);
  output[9] = alVar283;
  alVar283 = (__m128i)psubsw(auVar214,auVar118);
  output[0x16] = alVar283;
  alVar283 = (__m128i)paddsw(auVar8,auVar328);
  output[10] = alVar283;
  alVar283 = (__m128i)psubsw(auVar8,auVar328);
  output[0x15] = alVar283;
  alVar283 = (__m128i)paddsw(auVar264,auVar191);
  output[0xb] = alVar283;
  alVar283 = (__m128i)psubsw(auVar264,auVar191);
  output[0x14] = alVar283;
  alVar283 = (__m128i)paddsw(auVar326,auVar98);
  output[0xc] = alVar283;
  alVar283 = (__m128i)psubsw(auVar326,auVar98);
  output[0x13] = alVar283;
  alVar283 = (__m128i)paddsw(auVar50,auVar95);
  output[0xd] = alVar283;
  alVar283 = (__m128i)psubsw(auVar50,auVar95);
  output[0x12] = alVar283;
  alVar283 = (__m128i)paddsw(auVar287,auVar315);
  output[0xe] = alVar283;
  alVar283 = (__m128i)psubsw(auVar287,auVar315);
  output[0x11] = alVar283;
  alVar283 = (__m128i)paddsw(auVar14,auVar286);
  output[0xf] = alVar283;
  alVar283 = (__m128i)psubsw(auVar14,auVar286);
  output[0x10] = alVar283;
  return;
}

Assistant:

static void idct32_sse2(const __m128i *input, __m128i *output) {
  const int8_t cos_bit = INV_COS_BIT;
  const int32_t *cospi = cospi_arr(INV_COS_BIT);
  const __m128i __rounding = _mm_set1_epi32(1 << (INV_COS_BIT - 1));

  const __m128i cospi_p62_m02 = pair_set_epi16(cospi[62], -cospi[2]);
  const __m128i cospi_p02_p62 = pair_set_epi16(cospi[2], cospi[62]);
  const __m128i cospi_p30_m34 = pair_set_epi16(cospi[30], -cospi[34]);
  const __m128i cospi_p34_p30 = pair_set_epi16(cospi[34], cospi[30]);
  const __m128i cospi_p46_m18 = pair_set_epi16(cospi[46], -cospi[18]);
  const __m128i cospi_p18_p46 = pair_set_epi16(cospi[18], cospi[46]);
  const __m128i cospi_p14_m50 = pair_set_epi16(cospi[14], -cospi[50]);
  const __m128i cospi_p50_p14 = pair_set_epi16(cospi[50], cospi[14]);
  const __m128i cospi_p54_m10 = pair_set_epi16(cospi[54], -cospi[10]);
  const __m128i cospi_p10_p54 = pair_set_epi16(cospi[10], cospi[54]);
  const __m128i cospi_p22_m42 = pair_set_epi16(cospi[22], -cospi[42]);
  const __m128i cospi_p42_p22 = pair_set_epi16(cospi[42], cospi[22]);
  const __m128i cospi_p38_m26 = pair_set_epi16(cospi[38], -cospi[26]);
  const __m128i cospi_p26_p38 = pair_set_epi16(cospi[26], cospi[38]);
  const __m128i cospi_p06_m58 = pair_set_epi16(cospi[6], -cospi[58]);
  const __m128i cospi_p58_p06 = pair_set_epi16(cospi[58], cospi[6]);
  const __m128i cospi_p60_m04 = pair_set_epi16(cospi[60], -cospi[4]);
  const __m128i cospi_p04_p60 = pair_set_epi16(cospi[4], cospi[60]);
  const __m128i cospi_p28_m36 = pair_set_epi16(cospi[28], -cospi[36]);
  const __m128i cospi_p36_p28 = pair_set_epi16(cospi[36], cospi[28]);
  const __m128i cospi_p44_m20 = pair_set_epi16(cospi[44], -cospi[20]);
  const __m128i cospi_p20_p44 = pair_set_epi16(cospi[20], cospi[44]);
  const __m128i cospi_p12_m52 = pair_set_epi16(cospi[12], -cospi[52]);
  const __m128i cospi_p52_p12 = pair_set_epi16(cospi[52], cospi[12]);
  const __m128i cospi_p56_m08 = pair_set_epi16(cospi[56], -cospi[8]);
  const __m128i cospi_p08_p56 = pair_set_epi16(cospi[8], cospi[56]);
  const __m128i cospi_p24_m40 = pair_set_epi16(cospi[24], -cospi[40]);
  const __m128i cospi_p40_p24 = pair_set_epi16(cospi[40], cospi[24]);
  const __m128i cospi_p32_p32 = pair_set_epi16(cospi[32], cospi[32]);
  const __m128i cospi_p32_m32 = pair_set_epi16(cospi[32], -cospi[32]);
  const __m128i cospi_p48_m16 = pair_set_epi16(cospi[48], -cospi[16]);
  const __m128i cospi_p16_p48 = pair_set_epi16(cospi[16], cospi[48]);

  // stage 1
  __m128i x[32];
  x[0] = input[0];
  x[1] = input[16];
  x[2] = input[8];
  x[3] = input[24];
  x[4] = input[4];
  x[5] = input[20];
  x[6] = input[12];
  x[7] = input[28];
  x[8] = input[2];
  x[9] = input[18];
  x[10] = input[10];
  x[11] = input[26];
  x[12] = input[6];
  x[13] = input[22];
  x[14] = input[14];
  x[15] = input[30];
  x[16] = input[1];
  x[17] = input[17];
  x[18] = input[9];
  x[19] = input[25];
  x[20] = input[5];
  x[21] = input[21];
  x[22] = input[13];
  x[23] = input[29];
  x[24] = input[3];
  x[25] = input[19];
  x[26] = input[11];
  x[27] = input[27];
  x[28] = input[7];
  x[29] = input[23];
  x[30] = input[15];
  x[31] = input[31];

  // stage 2
  btf_16_sse2(cospi_p62_m02, cospi_p02_p62, x[16], x[31], x[16], x[31]);
  btf_16_sse2(cospi_p30_m34, cospi_p34_p30, x[17], x[30], x[17], x[30]);
  btf_16_sse2(cospi_p46_m18, cospi_p18_p46, x[18], x[29], x[18], x[29]);
  btf_16_sse2(cospi_p14_m50, cospi_p50_p14, x[19], x[28], x[19], x[28]);
  btf_16_sse2(cospi_p54_m10, cospi_p10_p54, x[20], x[27], x[20], x[27]);
  btf_16_sse2(cospi_p22_m42, cospi_p42_p22, x[21], x[26], x[21], x[26]);
  btf_16_sse2(cospi_p38_m26, cospi_p26_p38, x[22], x[25], x[22], x[25]);
  btf_16_sse2(cospi_p06_m58, cospi_p58_p06, x[23], x[24], x[23], x[24]);

  // stage 3
  btf_16_sse2(cospi_p60_m04, cospi_p04_p60, x[8], x[15], x[8], x[15]);
  btf_16_sse2(cospi_p28_m36, cospi_p36_p28, x[9], x[14], x[9], x[14]);
  btf_16_sse2(cospi_p44_m20, cospi_p20_p44, x[10], x[13], x[10], x[13]);
  btf_16_sse2(cospi_p12_m52, cospi_p52_p12, x[11], x[12], x[11], x[12]);
  idct32_high16_stage3_sse2(x);

  // stage 4
  btf_16_sse2(cospi_p56_m08, cospi_p08_p56, x[4], x[7], x[4], x[7]);
  btf_16_sse2(cospi_p24_m40, cospi_p40_p24, x[5], x[6], x[5], x[6]);
  btf_16_adds_subs_sse2(x[8], x[9]);
  btf_16_subs_adds_sse2(x[11], x[10]);
  btf_16_adds_subs_sse2(x[12], x[13]);
  btf_16_subs_adds_sse2(x[15], x[14]);
  idct32_high16_stage4_sse2(x, cospi, __rounding, cos_bit);

  // stage 5
  btf_16_sse2(cospi_p32_p32, cospi_p32_m32, x[0], x[1], x[0], x[1]);
  btf_16_sse2(cospi_p48_m16, cospi_p16_p48, x[2], x[3], x[2], x[3]);
  btf_16_adds_subs_sse2(x[4], x[5]);
  btf_16_adds_subs_sse2(x[7], x[6]);
  idct32_high24_stage5_sse2(x, cospi, __rounding, cos_bit);

  // stage 6
  btf_16_adds_subs_sse2(x[0], x[3]);
  btf_16_adds_subs_sse2(x[1], x[2]);
  idct32_high28_stage6_sse2(x, cospi, __rounding, cos_bit);

  // stage 7~8
  idct32_stage7_sse2(x, cospi, __rounding, cos_bit);
  idct32_stage8_sse2(x, cospi, __rounding, cos_bit);
  idct32_stage9_sse2(output, x);
}